

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx2::CurveNiMBIntersectorK<4,4>::
     intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  Primitive PVar4;
  uint uVar5;
  Geometry *pGVar6;
  __int_type_conflict _Var7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  int iVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  bool bVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  uint uVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  ulong uVar62;
  long lVar64;
  byte bVar65;
  uint uVar66;
  ulong uVar67;
  long lVar68;
  float fVar69;
  vint4 bi_2;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined4 uVar70;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined8 extraout_XMM1_Qa;
  vint4 bi_1;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 extraout_var [56];
  float fVar111;
  float fVar125;
  float fVar126;
  vint4 bi;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar127;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar128;
  float fVar141;
  float fVar142;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar143;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  vint4 ai_2;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  float fVar160;
  float fVar172;
  float fVar173;
  vint4 ai_1;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar174;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar175;
  undefined1 auVar171 [32];
  float fVar176;
  undefined8 uVar177;
  float fVar201;
  vint4 ai;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar193 [16];
  float fVar203;
  float fVar204;
  float fVar205;
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar200;
  float fVar202;
  undefined1 auVar199 [32];
  float fVar206;
  float fVar224;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar230 [16];
  undefined1 auVar241 [32];
  float fVar242;
  float fVar255;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [32];
  float fVar256;
  float fVar271;
  float fVar272;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  float fVar273;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  float fVar274;
  float fVar275;
  float fVar276;
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [32];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar304 [16];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  float fVar315;
  float fVar326;
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [32];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_668 [16];
  float local_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  undefined1 local_638 [8];
  float fStack_630;
  float fStack_62c;
  undefined1 local_608 [8];
  float fStack_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  undefined1 local_5e8 [8];
  undefined8 uStack_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  float local_5c8;
  float fStack_5c4;
  float fStack_5c0;
  float fStack_5bc;
  undefined1 local_5a8 [8];
  float fStack_5a0;
  float fStack_59c;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 *local_458;
  Primitive *local_450;
  RTCFilterFunctionNArguments local_448;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  uint auStack_3b8 [4];
  uint local_3a8;
  uint uStack_3a4;
  uint uStack_3a0;
  uint uStack_39c;
  uint local_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  undefined1 local_388 [16];
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [32];
  uint uStack_268;
  float afStack_264 [7];
  RTCHitN local_248 [16];
  undefined1 local_238 [16];
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [16];
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar63;
  undefined1 auVar110 [64];
  undefined1 auVar138 [32];
  
  PVar4 = prim[1];
  uVar62 = (ulong)(byte)PVar4;
  lVar64 = uVar62 * 0x25;
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar85 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar85 = vinsertps_avx(auVar85,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar69 = *(float *)(prim + lVar64 + 0x12);
  auVar13 = vsubps_avx(auVar13,*(undefined1 (*) [16])(prim + lVar64 + 6));
  auVar71._0_4_ = fVar69 * auVar13._0_4_;
  auVar71._4_4_ = fVar69 * auVar13._4_4_;
  auVar71._8_4_ = fVar69 * auVar13._8_4_;
  auVar71._12_4_ = fVar69 * auVar13._12_4_;
  auVar233._0_4_ = fVar69 * auVar85._0_4_;
  auVar233._4_4_ = fVar69 * auVar85._4_4_;
  auVar233._8_4_ = fVar69 * auVar85._8_4_;
  auVar233._12_4_ = fVar69 * auVar85._12_4_;
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 4 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 5 + 6)));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar321 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 6 + 6)));
  auVar321 = vcvtdq2ps_avx(auVar321);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0xf + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar4 * 0x10 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar182 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar62 + 6)));
  auVar162 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0x1a + 6)));
  auVar182 = vcvtdq2ps_avx(auVar182);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0x1b + 6)));
  auVar162 = vcvtdq2ps_avx(auVar162);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0x1c + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar316._4_4_ = auVar233._0_4_;
  auVar316._0_4_ = auVar233._0_4_;
  auVar316._8_4_ = auVar233._0_4_;
  auVar316._12_4_ = auVar233._0_4_;
  auVar18 = vshufps_avx(auVar233,auVar233,0x55);
  auVar209 = vshufps_avx(auVar233,auVar233,0xaa);
  fVar69 = auVar209._0_4_;
  auVar257._0_4_ = fVar69 * auVar321._0_4_;
  fVar160 = auVar209._4_4_;
  auVar257._4_4_ = fVar160 * auVar321._4_4_;
  fVar172 = auVar209._8_4_;
  auVar257._8_4_ = fVar172 * auVar321._8_4_;
  fVar173 = auVar209._12_4_;
  auVar257._12_4_ = fVar173 * auVar321._12_4_;
  auVar243._0_4_ = auVar182._0_4_ * fVar69;
  auVar243._4_4_ = auVar182._4_4_ * fVar160;
  auVar243._8_4_ = auVar182._8_4_ * fVar172;
  auVar243._12_4_ = auVar182._12_4_ * fVar173;
  auVar225._0_4_ = auVar17._0_4_ * fVar69;
  auVar225._4_4_ = auVar17._4_4_ * fVar160;
  auVar225._8_4_ = auVar17._8_4_ * fVar172;
  auVar225._12_4_ = auVar17._12_4_ * fVar173;
  auVar209 = vfmadd231ps_fma(auVar257,auVar18,auVar85);
  auVar258 = vfmadd231ps_fma(auVar243,auVar18,auVar15);
  auVar18 = vfmadd231ps_fma(auVar225,auVar16,auVar18);
  auVar73 = vfmadd231ps_fma(auVar209,auVar316,auVar13);
  auVar258 = vfmadd231ps_fma(auVar258,auVar316,auVar14);
  auVar74 = vfmadd231ps_fma(auVar18,auVar162,auVar316);
  auVar317._4_4_ = auVar71._0_4_;
  auVar317._0_4_ = auVar71._0_4_;
  auVar317._8_4_ = auVar71._0_4_;
  auVar317._12_4_ = auVar71._0_4_;
  auVar18 = vshufps_avx(auVar71,auVar71,0x55);
  auVar209 = vshufps_avx(auVar71,auVar71,0xaa);
  fVar69 = auVar209._0_4_;
  auVar112._0_4_ = fVar69 * auVar321._0_4_;
  fVar160 = auVar209._4_4_;
  auVar112._4_4_ = fVar160 * auVar321._4_4_;
  fVar172 = auVar209._8_4_;
  auVar112._8_4_ = fVar172 * auVar321._8_4_;
  fVar173 = auVar209._12_4_;
  auVar112._12_4_ = fVar173 * auVar321._12_4_;
  auVar88._0_4_ = auVar182._0_4_ * fVar69;
  auVar88._4_4_ = auVar182._4_4_ * fVar160;
  auVar88._8_4_ = auVar182._8_4_ * fVar172;
  auVar88._12_4_ = auVar182._12_4_ * fVar173;
  auVar72._0_4_ = auVar17._0_4_ * fVar69;
  auVar72._4_4_ = auVar17._4_4_ * fVar160;
  auVar72._8_4_ = auVar17._8_4_ * fVar172;
  auVar72._12_4_ = auVar17._12_4_ * fVar173;
  auVar85 = vfmadd231ps_fma(auVar112,auVar18,auVar85);
  auVar321 = vfmadd231ps_fma(auVar88,auVar18,auVar15);
  auVar15 = vfmadd231ps_fma(auVar72,auVar18,auVar16);
  auVar88 = vfmadd231ps_fma(auVar85,auVar317,auVar13);
  auVar89 = vfmadd231ps_fma(auVar321,auVar317,auVar14);
  auVar327._8_4_ = 0x7fffffff;
  auVar327._0_8_ = 0x7fffffff7fffffff;
  auVar327._12_4_ = 0x7fffffff;
  auVar13 = vandps_avx(auVar73,auVar327);
  auVar207._8_4_ = 0x219392ef;
  auVar207._0_8_ = 0x219392ef219392ef;
  auVar207._12_4_ = 0x219392ef;
  auVar13 = vcmpps_avx(auVar13,auVar207,1);
  auVar85 = vblendvps_avx(auVar73,auVar207,auVar13);
  auVar13 = vandps_avx(auVar258,auVar327);
  auVar13 = vcmpps_avx(auVar13,auVar207,1);
  auVar321 = vblendvps_avx(auVar258,auVar207,auVar13);
  auVar13 = vandps_avx(auVar74,auVar327);
  auVar13 = vcmpps_avx(auVar13,auVar207,1);
  auVar13 = vblendvps_avx(auVar74,auVar207,auVar13);
  auVar90 = vfmadd231ps_fma(auVar15,auVar317,auVar162);
  auVar14 = vrcpps_avx(auVar85);
  auVar208._8_4_ = 0x3f800000;
  auVar208._0_8_ = &DAT_3f8000003f800000;
  auVar208._12_4_ = 0x3f800000;
  auVar85 = vfnmadd213ps_fma(auVar85,auVar14,auVar208);
  auVar73 = vfmadd132ps_fma(auVar85,auVar14,auVar14);
  auVar85 = vrcpps_avx(auVar321);
  auVar321 = vfnmadd213ps_fma(auVar321,auVar85,auVar208);
  auVar74 = vfmadd132ps_fma(auVar321,auVar85,auVar85);
  auVar85 = vrcpps_avx(auVar13);
  auVar13 = vfnmadd213ps_fma(auVar13,auVar85,auVar208);
  auVar71 = vfmadd132ps_fma(auVar13,auVar85,auVar85);
  fVar69 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar64 + 0x16)) *
           *(float *)(prim + lVar64 + 0x1a);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar62 * 7 + 6);
  auVar13 = vpmovsxwd_avx(auVar13);
  auVar178._4_4_ = fVar69;
  auVar178._0_4_ = fVar69;
  auVar178._8_4_ = fVar69;
  auVar178._12_4_ = fVar69;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar62 * 0xb + 6);
  auVar85 = vpmovsxwd_avx(auVar85);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar13);
  auVar72 = vfmadd213ps_fma(auVar85,auVar178,auVar13);
  auVar321._8_8_ = 0;
  auVar321._0_8_ = *(ulong *)(prim + uVar62 * 9 + 6);
  auVar13 = vpmovsxwd_avx(auVar321);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar62 * 0xd + 6);
  auVar85 = vpmovsxwd_avx(auVar14);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar13);
  auVar321 = vfmadd213ps_fma(auVar85,auVar178,auVar13);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar62 * 0x12 + 6);
  auVar13 = vpmovsxwd_avx(auVar15);
  uVar67 = (ulong)(uint)((int)(uVar62 * 5) << 2);
  auVar182._8_8_ = 0;
  auVar182._0_8_ = *(ulong *)(prim + uVar62 * 2 + uVar67 + 6);
  auVar85 = vpmovsxwd_avx(auVar182);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar13);
  auVar14 = vfmadd213ps_fma(auVar85,auVar178,auVar13);
  auVar162._8_8_ = 0;
  auVar162._0_8_ = *(ulong *)(prim + uVar67 + 6);
  auVar13 = vpmovsxwd_avx(auVar162);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar62 * 0x18 + 6);
  auVar85 = vpmovsxwd_avx(auVar16);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar13);
  auVar15 = vfmadd213ps_fma(auVar85,auVar178,auVar13);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar62 * 0x1d + 6);
  auVar13 = vpmovsxwd_avx(auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar62 + (ulong)(byte)PVar4 * 0x20 + 6);
  auVar85 = vpmovsxwd_avx(auVar18);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar13);
  auVar182 = vfmadd213ps_fma(auVar85,auVar178,auVar13);
  auVar209._8_8_ = 0;
  auVar209._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar4 * 0x20 - uVar62) + 6);
  auVar13 = vpmovsxwd_avx(auVar209);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar258._8_8_ = 0;
  auVar258._0_8_ = *(ulong *)(prim + uVar62 * 0x23 + 6);
  auVar85 = vpmovsxwd_avx(auVar258);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar13);
  auVar85 = vfmadd213ps_fma(auVar85,auVar178,auVar13);
  auVar13 = vsubps_avx(auVar72,auVar88);
  auVar179._0_4_ = auVar73._0_4_ * auVar13._0_4_;
  auVar179._4_4_ = auVar73._4_4_ * auVar13._4_4_;
  auVar179._8_4_ = auVar73._8_4_ * auVar13._8_4_;
  auVar179._12_4_ = auVar73._12_4_ * auVar13._12_4_;
  auVar13 = vsubps_avx(auVar321,auVar88);
  auVar113._0_4_ = auVar73._0_4_ * auVar13._0_4_;
  auVar113._4_4_ = auVar73._4_4_ * auVar13._4_4_;
  auVar113._8_4_ = auVar73._8_4_ * auVar13._8_4_;
  auVar113._12_4_ = auVar73._12_4_ * auVar13._12_4_;
  auVar13 = vsubps_avx(auVar14,auVar89);
  auVar161._0_4_ = auVar74._0_4_ * auVar13._0_4_;
  auVar161._4_4_ = auVar74._4_4_ * auVar13._4_4_;
  auVar161._8_4_ = auVar74._8_4_ * auVar13._8_4_;
  auVar161._12_4_ = auVar74._12_4_ * auVar13._12_4_;
  auVar13 = vsubps_avx(auVar15,auVar89);
  auVar89._0_4_ = auVar74._0_4_ * auVar13._0_4_;
  auVar89._4_4_ = auVar74._4_4_ * auVar13._4_4_;
  auVar89._8_4_ = auVar74._8_4_ * auVar13._8_4_;
  auVar89._12_4_ = auVar74._12_4_ * auVar13._12_4_;
  auVar13 = vsubps_avx(auVar182,auVar90);
  auVar150._0_4_ = auVar71._0_4_ * auVar13._0_4_;
  auVar150._4_4_ = auVar71._4_4_ * auVar13._4_4_;
  auVar150._8_4_ = auVar71._8_4_ * auVar13._8_4_;
  auVar150._12_4_ = auVar71._12_4_ * auVar13._12_4_;
  auVar13 = vsubps_avx(auVar85,auVar90);
  auVar73._0_4_ = auVar71._0_4_ * auVar13._0_4_;
  auVar73._4_4_ = auVar71._4_4_ * auVar13._4_4_;
  auVar73._8_4_ = auVar71._8_4_ * auVar13._8_4_;
  auVar73._12_4_ = auVar71._12_4_ * auVar13._12_4_;
  auVar13 = vpminsd_avx(auVar179,auVar113);
  auVar85 = vpminsd_avx(auVar161,auVar89);
  auVar13 = vmaxps_avx(auVar13,auVar85);
  auVar85 = vpminsd_avx(auVar150,auVar73);
  uVar70 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar226._4_4_ = uVar70;
  auVar226._0_4_ = uVar70;
  auVar226._8_4_ = uVar70;
  auVar226._12_4_ = uVar70;
  auVar85 = vmaxps_avx(auVar85,auVar226);
  auVar13 = vmaxps_avx(auVar13,auVar85);
  local_388._0_4_ = auVar13._0_4_ * 0.99999964;
  local_388._4_4_ = auVar13._4_4_ * 0.99999964;
  local_388._8_4_ = auVar13._8_4_ * 0.99999964;
  local_388._12_4_ = auVar13._12_4_ * 0.99999964;
  auVar13 = vpmaxsd_avx(auVar179,auVar113);
  auVar85 = vpmaxsd_avx(auVar161,auVar89);
  auVar13 = vminps_avx(auVar13,auVar85);
  auVar85 = vpmaxsd_avx(auVar150,auVar73);
  uVar70 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar114._4_4_ = uVar70;
  auVar114._0_4_ = uVar70;
  auVar114._8_4_ = uVar70;
  auVar114._12_4_ = uVar70;
  auVar85 = vminps_avx(auVar85,auVar114);
  auVar13 = vminps_avx(auVar13,auVar85);
  auVar74._0_4_ = auVar13._0_4_ * 1.0000004;
  auVar74._4_4_ = auVar13._4_4_ * 1.0000004;
  auVar74._8_4_ = auVar13._8_4_ * 1.0000004;
  auVar74._12_4_ = auVar13._12_4_ * 1.0000004;
  auVar90._1_3_ = 0;
  auVar90[0] = PVar4;
  auVar90[4] = PVar4;
  auVar90._5_3_ = 0;
  auVar90[8] = PVar4;
  auVar90._9_3_ = 0;
  auVar90[0xc] = PVar4;
  auVar90._13_3_ = 0;
  auVar85 = vpcmpgtd_avx(auVar90,_DAT_01ff0cf0);
  auVar13 = vcmpps_avx(local_388,auVar74,2);
  auVar13 = vandps_avx(auVar13,auVar85);
  uVar58 = vmovmskps_avx(auVar13);
  if (uVar58 == 0) {
    return;
  }
  uVar58 = uVar58 & 0xff;
  auVar87._16_16_ = mm_lookupmask_ps._240_16_;
  auVar87._0_16_ = mm_lookupmask_ps._240_16_;
  local_288 = vblendps_avx(auVar87,ZEXT832(0) << 0x20,0x80);
  local_458 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_450 = prim;
LAB_0175f43e:
  lVar64 = 0;
  for (uVar62 = (ulong)uVar58; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
    lVar64 = lVar64 + 1;
  }
  uVar61 = *(uint *)(local_450 + 2);
  uVar5 = *(uint *)(local_450 + lVar64 * 4 + 6);
  pGVar6 = (context->scene->geometries).items[uVar61].ptr;
  fVar69 = (pGVar6->time_range).lower;
  fVar69 = pGVar6->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0x70) - fVar69) / ((pGVar6->time_range).upper - fVar69));
  auVar13 = vroundss_avx(ZEXT416((uint)fVar69),ZEXT416((uint)fVar69),9);
  auVar13 = vminss_avx(auVar13,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
  auVar209 = vmaxss_avx(ZEXT816(0),auVar13);
  uVar62 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           (ulong)uVar5 *
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var7 = pGVar6[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar68 = (long)(int)auVar209._0_4_ * 0x38;
  lVar8 = *(long *)(_Var7 + lVar68);
  lVar9 = *(long *)(_Var7 + 0x10 + lVar68);
  auVar13 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar62);
  lVar64 = uVar62 + 1;
  auVar85 = *(undefined1 (*) [16])(lVar8 + lVar9 * lVar64);
  lVar1 = uVar62 + 2;
  auVar321 = *(undefined1 (*) [16])(lVar8 + lVar9 * lVar1);
  lVar2 = uVar62 + 3;
  auVar14 = *(undefined1 (*) [16])(lVar8 + lVar9 * lVar2);
  lVar8 = *(long *)&pGVar6[4].fnumTimeSegments;
  lVar9 = *(long *)(lVar8 + lVar68);
  lVar10 = *(long *)(lVar8 + 0x10 + lVar68);
  auVar15 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar62);
  auVar182 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar64);
  auVar162 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar1);
  auVar16 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar2);
  auVar258 = ZEXT816(0) << 0x40;
  auVar287._0_4_ = auVar14._0_4_ * 0.0;
  auVar287._4_4_ = auVar14._4_4_ * 0.0;
  auVar287._8_4_ = auVar14._8_4_ * 0.0;
  auVar287._12_4_ = auVar14._12_4_ * 0.0;
  auVar17 = vfmadd231ps_fma(auVar287,auVar321,auVar258);
  auVar74 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar85,auVar17);
  auVar318._8_4_ = 0x40400000;
  auVar318._0_8_ = 0x4040000040400000;
  auVar318._12_4_ = 0x40400000;
  auVar17 = vfmadd231ps_fma(auVar17,auVar85,auVar318);
  auVar150 = vfnmadd231ps_fma(auVar17,auVar13,auVar318);
  auVar180._0_4_ = auVar16._0_4_ * 0.0;
  auVar180._4_4_ = auVar16._4_4_ * 0.0;
  auVar180._8_4_ = auVar16._8_4_ * 0.0;
  auVar180._12_4_ = auVar16._12_4_ * 0.0;
  auVar18 = vfmadd231ps_fma(auVar180,auVar162,auVar258);
  auVar17 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar182,auVar18);
  auVar244._0_4_ = auVar15._0_4_ + auVar17._0_4_;
  auVar244._4_4_ = auVar15._4_4_ + auVar17._4_4_;
  auVar244._8_4_ = auVar15._8_4_ + auVar17._8_4_;
  auVar244._12_4_ = auVar15._12_4_ + auVar17._12_4_;
  auVar17 = vfmadd231ps_fma(auVar18,auVar182,auVar318);
  auVar18 = vfnmadd231ps_fma(auVar17,auVar15,auVar318);
  auVar71 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar321,auVar14);
  auVar129._0_4_ = auVar14._0_4_ * 3.0;
  auVar129._4_4_ = auVar14._4_4_ * 3.0;
  auVar129._8_4_ = auVar14._8_4_ * 3.0;
  auVar129._12_4_ = auVar14._12_4_ * 3.0;
  auVar321 = vfnmadd231ps_fma(auVar129,auVar318,auVar321);
  auVar321 = vfmadd231ps_fma(auVar321,auVar258,auVar85);
  auVar161 = vfnmadd231ps_fma(auVar321,auVar258,auVar13);
  auVar321 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar162,auVar16);
  auVar321 = vfmadd231ps_fma(auVar321,auVar182,auVar258);
  auVar17 = vfmadd231ps_fma(auVar321,auVar15,auVar258);
  auVar227._0_4_ = auVar16._0_4_ * 3.0;
  auVar227._4_4_ = auVar16._4_4_ * 3.0;
  auVar227._8_4_ = auVar16._8_4_ * 3.0;
  auVar227._12_4_ = auVar16._12_4_ * 3.0;
  auVar321 = vfnmadd231ps_fma(auVar227,auVar318,auVar162);
  auVar321 = vfmadd231ps_fma(auVar321,auVar258,auVar182);
  auVar15 = vfnmadd231ps_fma(auVar321,auVar258,auVar15);
  auVar321 = vshufps_avx(auVar150,auVar150,0xc9);
  auVar14 = vshufps_avx(auVar244,auVar244,0xc9);
  fVar200 = auVar150._0_4_;
  auVar91._0_4_ = fVar200 * auVar14._0_4_;
  fVar272 = auVar150._4_4_;
  auVar91._4_4_ = fVar272 * auVar14._4_4_;
  fVar201 = auVar150._8_4_;
  auVar91._8_4_ = fVar201 * auVar14._8_4_;
  fVar273 = auVar150._12_4_;
  auVar91._12_4_ = fVar273 * auVar14._12_4_;
  auVar88 = vfmsub231ps_fma(auVar91,auVar321,auVar244);
  auVar14 = vshufps_avx(auVar18,auVar18,0xc9);
  auVar92._0_4_ = fVar200 * auVar14._0_4_;
  auVar92._4_4_ = fVar272 * auVar14._4_4_;
  auVar92._8_4_ = fVar201 * auVar14._8_4_;
  auVar92._12_4_ = fVar273 * auVar14._12_4_;
  auVar89 = vfmsub231ps_fma(auVar92,auVar321,auVar18);
  local_5c8 = auVar161._0_4_;
  fStack_5c4 = auVar161._4_4_;
  fStack_5c0 = auVar161._8_4_;
  fStack_5bc = auVar161._12_4_;
  auVar321 = vshufps_avx(auVar161,auVar161,0xc9);
  auVar14 = vshufps_avx(auVar17,auVar17,0xc9);
  auVar93._0_4_ = local_5c8 * auVar14._0_4_;
  auVar93._4_4_ = fStack_5c4 * auVar14._4_4_;
  auVar93._8_4_ = fStack_5c0 * auVar14._8_4_;
  auVar93._12_4_ = fStack_5bc * auVar14._12_4_;
  auVar90 = vfmsub231ps_fma(auVar93,auVar321,auVar17);
  auVar14 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar94._0_4_ = local_5c8 * auVar14._0_4_;
  auVar94._4_4_ = fStack_5c4 * auVar14._4_4_;
  auVar94._8_4_ = fStack_5c0 * auVar14._8_4_;
  auVar94._12_4_ = fStack_5bc * auVar14._12_4_;
  auVar233 = vfmsub231ps_fma(auVar94,auVar321,auVar15);
  lVar9 = *(long *)(_Var7 + 0x38 + lVar68);
  lVar10 = *(long *)(_Var7 + 0x48 + lVar68);
  auVar321 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar64);
  auVar14 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar1);
  auVar15 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar2);
  lVar11 = *(long *)(lVar8 + 0x38 + lVar68);
  lVar8 = *(long *)(lVar8 + 0x48 + lVar68);
  auVar228._0_4_ = auVar15._0_4_ * 0.0;
  auVar228._4_4_ = auVar15._4_4_ * 0.0;
  auVar228._8_4_ = auVar15._8_4_ * 0.0;
  auVar228._12_4_ = auVar15._12_4_ * 0.0;
  auVar182 = vfmadd231ps_fma(auVar228,auVar14,auVar258);
  auVar72 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar321,auVar182);
  auVar162 = vfmadd231ps_fma(auVar182,auVar321,auVar318);
  auVar182 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar62);
  auVar178 = vfnmadd231ps_fma(auVar162,auVar182,auVar318);
  auVar162 = *(undefined1 (*) [16])(lVar11 + lVar1 * lVar8);
  auVar16 = *(undefined1 (*) [16])(lVar11 + lVar8 * lVar2);
  auVar301._0_4_ = auVar16._0_4_ * 0.0;
  auVar301._4_4_ = auVar16._4_4_ * 0.0;
  auVar301._8_4_ = auVar16._8_4_ * 0.0;
  auVar301._12_4_ = auVar16._12_4_ * 0.0;
  auVar73 = vfmadd231ps_fma(auVar301,auVar162,auVar258);
  auVar17 = *(undefined1 (*) [16])(lVar11 + lVar64 * lVar8);
  auVar258 = vfmadd213ps_fma(auVar258,auVar17,auVar73);
  auVar18 = *(undefined1 (*) [16])(lVar11 + uVar62 * lVar8);
  auVar277._0_4_ = auVar258._0_4_ + auVar18._0_4_;
  auVar277._4_4_ = auVar258._4_4_ + auVar18._4_4_;
  auVar277._8_4_ = auVar258._8_4_ + auVar18._8_4_;
  auVar277._12_4_ = auVar258._12_4_ + auVar18._12_4_;
  auVar258 = vshufps_avx(auVar277,auVar277,0xc9);
  fVar175 = auVar178._0_4_;
  auVar259._0_4_ = fVar175 * auVar258._0_4_;
  fVar256 = auVar178._4_4_;
  auVar259._4_4_ = fVar256 * auVar258._4_4_;
  fVar176 = auVar178._8_4_;
  auVar259._8_4_ = fVar176 * auVar258._8_4_;
  fVar271 = auVar178._12_4_;
  auVar259._12_4_ = fVar271 * auVar258._12_4_;
  auVar258 = vshufps_avx(auVar178,auVar178,0xc9);
  auVar112 = vfmsub231ps_fma(auVar259,auVar258,auVar277);
  auVar73 = vfmadd231ps_fma(auVar73,auVar17,auVar318);
  auVar113 = vfnmadd231ps_fma(auVar73,auVar18,auVar318);
  auVar73 = vshufps_avx(auVar113,auVar113,0xc9);
  auVar278._0_4_ = fVar175 * auVar73._0_4_;
  auVar278._4_4_ = fVar256 * auVar73._4_4_;
  auVar278._8_4_ = fVar176 * auVar73._8_4_;
  auVar278._12_4_ = fVar271 * auVar73._12_4_;
  auVar73 = vfmsub231ps_fma(auVar278,auVar258,auVar113);
  auVar258 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar14,auVar15);
  auVar319._0_4_ = auVar15._0_4_ * 3.0;
  auVar319._4_4_ = auVar15._4_4_ * 3.0;
  auVar319._8_4_ = auVar15._8_4_ * 3.0;
  auVar319._12_4_ = auVar15._12_4_ * 3.0;
  auVar113 = vfnmadd231ps_fma(auVar319,auVar318,auVar14);
  auVar14 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar162,auVar16);
  auVar130._0_4_ = auVar16._0_4_ * 3.0;
  auVar130._4_4_ = auVar16._4_4_ * 3.0;
  auVar130._8_4_ = auVar16._8_4_ * 3.0;
  auVar130._12_4_ = auVar16._12_4_ * 3.0;
  auVar15 = vfnmadd231ps_fma(auVar130,auVar318,auVar162);
  auVar114 = ZEXT816(0);
  auVar14 = vfmadd231ps_fma(auVar14,auVar17,auVar114);
  auVar15 = vfmadd231ps_fma(auVar15,auVar114,auVar17);
  auVar162 = vfmadd231ps_fma(auVar14,auVar18,auVar114);
  auVar16 = vfnmadd231ps_fma(auVar15,auVar114,auVar18);
  auVar14 = vfmadd231ps_fma(auVar113,auVar114,auVar321);
  auVar179 = vfnmadd231ps_fma(auVar14,auVar114,auVar182);
  auVar14 = vshufps_avx(auVar162,auVar162,0xc9);
  fVar202 = auVar179._0_4_;
  auVar95._0_4_ = fVar202 * auVar14._0_4_;
  fVar274 = auVar179._4_4_;
  auVar95._4_4_ = fVar274 * auVar14._4_4_;
  fVar203 = auVar179._8_4_;
  auVar95._8_4_ = fVar203 * auVar14._8_4_;
  fVar275 = auVar179._12_4_;
  auVar95._12_4_ = fVar275 * auVar14._12_4_;
  auVar14 = vshufps_avx(auVar179,auVar179,0xc9);
  auVar113 = vfmsub231ps_fma(auVar95,auVar14,auVar162);
  auVar15 = vshufps_avx(auVar16,auVar16,0xc9);
  auVar75._0_4_ = fVar202 * auVar15._0_4_;
  auVar75._4_4_ = fVar274 * auVar15._4_4_;
  auVar75._8_4_ = fVar203 * auVar15._8_4_;
  auVar75._12_4_ = fVar275 * auVar15._12_4_;
  auVar114 = vfmsub231ps_fma(auVar75,auVar14,auVar16);
  fVar69 = fVar69 - auVar209._0_4_;
  auVar50._12_4_ = 0;
  auVar50._0_12_ = ZEXT812(0);
  auVar85 = vfmadd231ps_fma(auVar71,auVar50 << 0x20,auVar85);
  local_658 = auVar74._0_4_;
  fStack_654 = auVar74._4_4_;
  fStack_650 = auVar74._8_4_;
  fStack_64c = auVar74._12_4_;
  auVar144._0_4_ = auVar13._0_4_ + local_658;
  auVar144._4_4_ = auVar13._4_4_ + fStack_654;
  auVar144._8_4_ = auVar13._8_4_ + fStack_650;
  auVar144._12_4_ = auVar13._12_4_ + fStack_64c;
  auVar17 = vfmadd231ps_fma(auVar85,auVar13,auVar50 << 0x20);
  auVar14 = vpermilps_avx(auVar88,0xc9);
  auVar13 = vdpps_avx(auVar14,auVar14,0x7f);
  fVar172 = auVar13._0_4_;
  auVar162 = ZEXT416((uint)fVar172);
  auVar85 = vrsqrtss_avx(auVar162,auVar162);
  fVar160 = auVar85._0_4_;
  auVar15 = vpermilps_avx(auVar89,0xc9);
  auVar85 = vdpps_avx(auVar14,auVar15,0x7f);
  fVar173 = fVar160 * 1.5 - fVar172 * 0.5 * fVar160 * fVar160 * fVar160;
  auVar245._0_4_ = fVar172 * auVar15._0_4_;
  auVar245._4_4_ = fVar172 * auVar15._4_4_;
  auVar245._8_4_ = fVar172 * auVar15._8_4_;
  auVar245._12_4_ = fVar172 * auVar15._12_4_;
  fVar160 = auVar85._0_4_;
  auVar96._0_4_ = fVar160 * auVar14._0_4_;
  auVar96._4_4_ = fVar160 * auVar14._4_4_;
  auVar96._8_4_ = fVar160 * auVar14._8_4_;
  auVar96._12_4_ = fVar160 * auVar14._12_4_;
  auVar15 = vsubps_avx(auVar245,auVar96);
  auVar85 = vrcpss_avx(auVar162,auVar162);
  auVar13 = vfnmadd213ss_fma(auVar13,auVar85,SUB6416(ZEXT464(0x40000000),0));
  fVar160 = auVar85._0_4_ * auVar13._0_4_;
  auVar162 = vpermilps_avx(auVar90,0xc9);
  auVar85 = vdpps_avx(auVar162,auVar162,0x7f);
  fVar111 = auVar14._0_4_ * fVar173;
  fVar125 = auVar14._4_4_ * fVar173;
  fVar126 = auVar14._8_4_ * fVar173;
  fVar127 = auVar14._12_4_ * fVar173;
  auVar13 = vblendps_avx(auVar85,_DAT_01feba10,0xe);
  auVar14 = vrsqrtss_avx(auVar13,auVar13);
  fVar172 = auVar85._0_4_;
  fVar174 = auVar14._0_4_;
  fVar174 = fVar174 * 1.5 - fVar172 * 0.5 * fVar174 * fVar174 * fVar174;
  auVar16 = vpermilps_avx(auVar233,0xc9);
  auVar14 = vdpps_avx(auVar162,auVar16,0x7f);
  auVar181._0_4_ = auVar16._0_4_ * fVar172;
  auVar181._4_4_ = auVar16._4_4_ * fVar172;
  auVar181._8_4_ = auVar16._8_4_ * fVar172;
  auVar181._12_4_ = auVar16._12_4_ * fVar172;
  fVar172 = auVar14._0_4_;
  auVar279._0_4_ = fVar172 * auVar162._0_4_;
  auVar279._4_4_ = fVar172 * auVar162._4_4_;
  auVar279._8_4_ = fVar172 * auVar162._8_4_;
  auVar279._12_4_ = fVar172 * auVar162._12_4_;
  auVar14 = vsubps_avx(auVar181,auVar279);
  auVar13 = vrcpss_avx(auVar13,auVar13);
  auVar85 = vfnmadd213ss_fma(auVar85,auVar13,ZEXT416(0x40000000));
  fVar172 = auVar13._0_4_ * auVar85._0_4_;
  fVar128 = auVar162._0_4_ * fVar174;
  fVar141 = auVar162._4_4_ * fVar174;
  fVar142 = auVar162._8_4_ * fVar174;
  fVar143 = auVar162._12_4_ * fVar174;
  auVar13 = vshufps_avx(auVar150,auVar150,0xff);
  auVar85 = vshufps_avx(auVar144,auVar144,0xff);
  auVar246._0_4_ = auVar85._0_4_ * fVar111;
  auVar246._4_4_ = auVar85._4_4_ * fVar125;
  auVar246._8_4_ = auVar85._8_4_ * fVar126;
  auVar246._12_4_ = auVar85._12_4_ * fVar127;
  auVar76._0_4_ = auVar13._0_4_ * fVar111 + auVar85._0_4_ * fVar173 * fVar160 * auVar15._0_4_;
  auVar76._4_4_ = auVar13._4_4_ * fVar125 + auVar85._4_4_ * fVar173 * fVar160 * auVar15._4_4_;
  auVar76._8_4_ = auVar13._8_4_ * fVar126 + auVar85._8_4_ * fVar173 * fVar160 * auVar15._8_4_;
  auVar76._12_4_ = auVar13._12_4_ * fVar127 + auVar85._12_4_ * fVar173 * fVar160 * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar144,auVar246);
  local_5a8._4_4_ = auVar246._4_4_ + auVar144._4_4_;
  local_5a8._0_4_ = auVar246._0_4_ + auVar144._0_4_;
  fStack_5a0 = auVar246._8_4_ + auVar144._8_4_;
  fStack_59c = auVar246._12_4_ + auVar144._12_4_;
  auVar162 = vsubps_avx(auVar150,auVar76);
  auVar13 = vshufps_avx(auVar161,auVar161,0xff);
  auVar85 = vshufps_avx(auVar17,auVar17,0xff);
  auVar131._0_4_ = auVar85._0_4_ * fVar128;
  auVar131._4_4_ = auVar85._4_4_ * fVar141;
  auVar131._8_4_ = auVar85._8_4_ * fVar142;
  auVar131._12_4_ = auVar85._12_4_ * fVar143;
  auVar97._0_4_ = auVar13._0_4_ * fVar128 + auVar85._0_4_ * fVar174 * auVar14._0_4_ * fVar172;
  auVar97._4_4_ = auVar13._4_4_ * fVar141 + auVar85._4_4_ * fVar174 * auVar14._4_4_ * fVar172;
  auVar97._8_4_ = auVar13._8_4_ * fVar142 + auVar85._8_4_ * fVar174 * auVar14._8_4_ * fVar172;
  auVar97._12_4_ = auVar13._12_4_ * fVar143 + auVar85._12_4_ * fVar174 * auVar14._12_4_ * fVar172;
  auVar14 = vsubps_avx(auVar17,auVar131);
  local_638._4_4_ = auVar17._4_4_ + auVar131._4_4_;
  local_638._0_4_ = auVar17._0_4_ + auVar131._0_4_;
  fStack_630 = auVar17._8_4_ + auVar131._8_4_;
  fStack_62c = auVar17._12_4_ + auVar131._12_4_;
  auVar16 = vsubps_avx(auVar161,auVar97);
  auVar85 = vfmadd231ps_fma(auVar258,ZEXT816(0) << 0x20,auVar321);
  local_488 = auVar72._0_4_;
  fStack_484 = auVar72._4_4_;
  fStack_480 = auVar72._8_4_;
  fStack_47c = auVar72._12_4_;
  auVar247._0_4_ = auVar182._0_4_ + local_488;
  auVar247._4_4_ = auVar182._4_4_ + fStack_484;
  auVar247._8_4_ = auVar182._8_4_ + fStack_480;
  auVar247._12_4_ = auVar182._12_4_ + fStack_47c;
  auVar17 = vpermilps_avx(auVar112,0xc9);
  auVar13 = vdpps_avx(auVar17,auVar17,0x7f);
  auVar18 = vfmadd231ps_fma(auVar85,auVar182,ZEXT816(0) << 0x20);
  fVar160 = auVar13._0_4_;
  auVar182 = ZEXT416((uint)fVar160);
  auVar85 = vrsqrtss_avx(auVar182,auVar182);
  fVar172 = auVar85._0_4_;
  fVar173 = fVar172 * 1.5 - fVar160 * 0.5 * fVar172 * fVar172 * fVar172;
  auVar85 = vpermilps_avx(auVar73,0xc9);
  auVar280._0_4_ = fVar160 * auVar85._0_4_;
  auVar280._4_4_ = fVar160 * auVar85._4_4_;
  auVar280._8_4_ = fVar160 * auVar85._8_4_;
  auVar280._12_4_ = fVar160 * auVar85._12_4_;
  auVar85 = vdpps_avx(auVar17,auVar85,0x7f);
  fVar160 = auVar85._0_4_;
  auVar260._0_4_ = fVar160 * auVar17._0_4_;
  auVar260._4_4_ = fVar160 * auVar17._4_4_;
  auVar260._8_4_ = fVar160 * auVar17._8_4_;
  auVar260._12_4_ = fVar160 * auVar17._12_4_;
  auVar321 = vsubps_avx(auVar280,auVar260);
  auVar85 = vrcpss_avx(auVar182,auVar182);
  auVar13 = vfnmadd213ss_fma(auVar13,auVar85,SUB6416(ZEXT464(0x40000000),0));
  fVar160 = auVar85._0_4_ * auVar13._0_4_;
  fVar128 = auVar17._0_4_ * fVar173;
  fVar141 = auVar17._4_4_ * fVar173;
  fVar142 = auVar17._8_4_ * fVar173;
  fVar143 = auVar17._12_4_ * fVar173;
  auVar17 = vpermilps_avx(auVar113,0xc9);
  auVar13 = vdpps_avx(auVar17,auVar17,0x7f);
  fVar172 = auVar13._0_4_;
  auVar209 = ZEXT416((uint)fVar172);
  auVar85 = vrsqrtss_avx(auVar209,auVar209);
  fVar174 = auVar85._0_4_;
  auVar182 = vpermilps_avx(auVar114,0xc9);
  auVar85 = vdpps_avx(auVar17,auVar182,0x7f);
  fVar174 = fVar174 * 1.5 - fVar172 * 0.5 * fVar174 * fVar174 * fVar174;
  auVar288._0_4_ = fVar172 * auVar182._0_4_;
  auVar288._4_4_ = fVar172 * auVar182._4_4_;
  auVar288._8_4_ = fVar172 * auVar182._8_4_;
  auVar288._12_4_ = fVar172 * auVar182._12_4_;
  fVar172 = auVar85._0_4_;
  auVar77._0_4_ = auVar17._0_4_ * fVar172;
  auVar77._4_4_ = auVar17._4_4_ * fVar172;
  auVar77._8_4_ = auVar17._8_4_ * fVar172;
  auVar77._12_4_ = auVar17._12_4_ * fVar172;
  auVar182 = vsubps_avx(auVar288,auVar77);
  auVar85 = vrcpss_avx(auVar209,auVar209);
  auVar13 = vfnmadd213ss_fma(auVar13,auVar85,SUB6416(ZEXT464(0x40000000),0));
  fVar172 = auVar85._0_4_ * auVar13._0_4_;
  fVar111 = auVar17._0_4_ * fVar174;
  fVar125 = auVar17._4_4_ * fVar174;
  fVar126 = auVar17._8_4_ * fVar174;
  fVar127 = auVar17._12_4_ * fVar174;
  auVar13 = vshufps_avx(auVar178,auVar178,0xff);
  auVar85 = vshufps_avx(auVar247,auVar247,0xff);
  auVar145._0_4_ = auVar85._0_4_ * fVar128;
  auVar145._4_4_ = auVar85._4_4_ * fVar141;
  auVar145._8_4_ = auVar85._8_4_ * fVar142;
  auVar145._12_4_ = auVar85._12_4_ * fVar143;
  auVar183._0_4_ = auVar13._0_4_ * fVar128 + fVar173 * auVar321._0_4_ * fVar160 * auVar85._0_4_;
  auVar183._4_4_ = auVar13._4_4_ * fVar141 + fVar173 * auVar321._4_4_ * fVar160 * auVar85._4_4_;
  auVar183._8_4_ = auVar13._8_4_ * fVar142 + fVar173 * auVar321._8_4_ * fVar160 * auVar85._8_4_;
  auVar183._12_4_ = auVar13._12_4_ * fVar143 + fVar173 * auVar321._12_4_ * fVar160 * auVar85._12_4_;
  auVar321 = vsubps_avx(auVar247,auVar145);
  auVar17 = vsubps_avx(auVar178,auVar183);
  auVar13 = vshufps_avx(auVar179,auVar179,0xff);
  auVar85 = vshufps_avx(auVar18,auVar18,0xff);
  auVar98._0_4_ = auVar85._0_4_ * fVar111;
  auVar98._4_4_ = auVar85._4_4_ * fVar125;
  auVar98._8_4_ = auVar85._8_4_ * fVar126;
  auVar98._12_4_ = auVar85._12_4_ * fVar127;
  auVar78._0_4_ = auVar13._0_4_ * fVar111 + auVar85._0_4_ * fVar174 * auVar182._0_4_ * fVar172;
  auVar78._4_4_ = auVar13._4_4_ * fVar125 + auVar85._4_4_ * fVar174 * auVar182._4_4_ * fVar172;
  auVar78._8_4_ = auVar13._8_4_ * fVar126 + auVar85._8_4_ * fVar174 * auVar182._8_4_ * fVar172;
  auVar78._12_4_ = auVar13._12_4_ * fVar127 + auVar85._12_4_ * fVar174 * auVar182._12_4_ * fVar172;
  auVar13 = vsubps_avx(auVar18,auVar98);
  auVar146._0_4_ = auVar18._0_4_ + auVar98._0_4_;
  auVar146._4_4_ = auVar18._4_4_ + auVar98._4_4_;
  auVar146._8_4_ = auVar18._8_4_ + auVar98._8_4_;
  auVar146._12_4_ = auVar18._12_4_ + auVar98._12_4_;
  auVar85 = vsubps_avx(auVar179,auVar78);
  local_5e8._0_4_ = auVar162._0_4_;
  local_5e8._4_4_ = auVar162._4_4_;
  uStack_5e0._0_4_ = auVar162._8_4_;
  uStack_5e0._4_4_ = auVar162._12_4_;
  auVar79._0_4_ = auVar15._0_4_ + (float)local_5e8._0_4_ * 0.33333334;
  auVar79._4_4_ = auVar15._4_4_ + (float)local_5e8._4_4_ * 0.33333334;
  auVar79._8_4_ = auVar15._8_4_ + (float)uStack_5e0 * 0.33333334;
  auVar79._12_4_ = auVar15._12_4_ + uStack_5e0._4_4_ * 0.33333334;
  fVar160 = 1.0 - fVar69;
  auVar248._4_4_ = fVar160;
  auVar248._0_4_ = fVar160;
  auVar248._8_4_ = fVar160;
  auVar248._12_4_ = fVar160;
  auVar210._0_4_ = fVar69 * auVar321._0_4_;
  auVar210._4_4_ = fVar69 * auVar321._4_4_;
  auVar210._8_4_ = fVar69 * auVar321._8_4_;
  auVar210._12_4_ = fVar69 * auVar321._12_4_;
  local_3f8 = vfmadd231ps_fma(auVar210,auVar248,auVar15);
  auVar115._0_4_ = fVar69 * (auVar17._0_4_ * 0.33333334 + auVar321._0_4_);
  auVar115._4_4_ = fVar69 * (auVar17._4_4_ * 0.33333334 + auVar321._4_4_);
  auVar115._8_4_ = fVar69 * (auVar17._8_4_ * 0.33333334 + auVar321._8_4_);
  auVar115._12_4_ = fVar69 * (auVar17._12_4_ * 0.33333334 + auVar321._12_4_);
  auVar162 = vfmadd231ps_fma(auVar115,auVar248,auVar79);
  auVar80._0_4_ = auVar16._0_4_ * 0.33333334;
  auVar80._4_4_ = auVar16._4_4_ * 0.33333334;
  auVar80._8_4_ = auVar16._8_4_ * 0.33333334;
  auVar80._12_4_ = auVar16._12_4_ * 0.33333334;
  auVar321 = vsubps_avx(auVar14,auVar80);
  auVar302._0_4_ = auVar246._0_4_ + auVar144._0_4_ + (fVar200 + auVar76._0_4_) * 0.33333334;
  auVar302._4_4_ = auVar246._4_4_ + auVar144._4_4_ + (fVar272 + auVar76._4_4_) * 0.33333334;
  auVar302._8_4_ = auVar246._8_4_ + auVar144._8_4_ + (fVar201 + auVar76._8_4_) * 0.33333334;
  auVar302._12_4_ = auVar246._12_4_ + auVar144._12_4_ + (fVar273 + auVar76._12_4_) * 0.33333334;
  auVar211._0_4_ = (local_5c8 + auVar97._0_4_) * 0.33333334;
  auVar211._4_4_ = (fStack_5c4 + auVar97._4_4_) * 0.33333334;
  auVar211._8_4_ = (fStack_5c0 + auVar97._8_4_) * 0.33333334;
  auVar211._12_4_ = (fStack_5bc + auVar97._12_4_) * 0.33333334;
  auVar15 = vsubps_avx(_local_638,auVar211);
  auVar289._0_4_ = auVar85._0_4_ * 0.33333334;
  auVar289._4_4_ = auVar85._4_4_ * 0.33333334;
  auVar289._8_4_ = auVar85._8_4_ * 0.33333334;
  auVar289._12_4_ = auVar85._12_4_ * 0.33333334;
  auVar85 = vsubps_avx(auVar13,auVar289);
  auVar261._0_4_ = (fVar202 + auVar78._0_4_) * 0.33333334;
  auVar261._4_4_ = (fVar274 + auVar78._4_4_) * 0.33333334;
  auVar261._8_4_ = (fVar203 + auVar78._8_4_) * 0.33333334;
  auVar261._12_4_ = (fVar275 + auVar78._12_4_) * 0.33333334;
  auVar182 = vsubps_avx(auVar146,auVar261);
  auVar290._0_4_ = fVar69 * auVar85._0_4_;
  auVar290._4_4_ = fVar69 * auVar85._4_4_;
  auVar290._8_4_ = fVar69 * auVar85._8_4_;
  auVar290._12_4_ = fVar69 * auVar85._12_4_;
  auVar229._0_4_ = fVar69 * auVar13._0_4_;
  auVar229._4_4_ = fVar69 * auVar13._4_4_;
  auVar229._8_4_ = fVar69 * auVar13._8_4_;
  auVar229._12_4_ = fVar69 * auVar13._12_4_;
  local_408 = vfmadd231ps_fma(auVar290,auVar248,auVar321);
  auVar16 = vfmadd231ps_fma(auVar229,auVar248,auVar14);
  auVar81._0_4_ = fVar69 * (auVar247._0_4_ + auVar145._0_4_);
  auVar81._4_4_ = fVar69 * (auVar247._4_4_ + auVar145._4_4_);
  auVar81._8_4_ = fVar69 * (auVar247._8_4_ + auVar145._8_4_);
  auVar81._12_4_ = fVar69 * (auVar247._12_4_ + auVar145._12_4_);
  auVar163._0_4_ =
       fVar69 * (auVar247._0_4_ + auVar145._0_4_ + (fVar175 + auVar183._0_4_) * 0.33333334);
  auVar163._4_4_ =
       fVar69 * (auVar247._4_4_ + auVar145._4_4_ + (fVar256 + auVar183._4_4_) * 0.33333334);
  auVar163._8_4_ =
       fVar69 * (auVar247._8_4_ + auVar145._8_4_ + (fVar176 + auVar183._8_4_) * 0.33333334);
  auVar163._12_4_ =
       fVar69 * (auVar247._12_4_ + auVar145._12_4_ + (fVar271 + auVar183._12_4_) * 0.33333334);
  auVar184._0_4_ = fVar69 * auVar182._0_4_;
  auVar184._4_4_ = fVar69 * auVar182._4_4_;
  auVar184._8_4_ = fVar69 * auVar182._8_4_;
  auVar184._12_4_ = fVar69 * auVar182._12_4_;
  auVar99._0_4_ = fVar69 * auVar146._0_4_;
  auVar99._4_4_ = fVar69 * auVar146._4_4_;
  auVar99._8_4_ = fVar69 * auVar146._8_4_;
  auVar99._12_4_ = fVar69 * auVar146._12_4_;
  _local_418 = vfmadd231ps_fma(auVar81,auVar248,_local_5a8);
  auVar17 = vfmadd231ps_fma(auVar163,auVar248,auVar302);
  auVar18 = vfmadd231ps_fma(auVar184,auVar248,auVar15);
  auVar209 = vfmadd231ps_fma(auVar99,auVar248,_local_638);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_3d8 = vsubps_avx(local_3f8,auVar13);
  auVar85 = vshufps_avx(local_3d8,local_3d8,0x55);
  auVar321 = vshufps_avx(local_3d8,local_3d8,0xaa);
  aVar3 = pre->ray_space[k].vy.field_0;
  fVar69 = pre->ray_space[k].vz.field_0.m128[0];
  fVar160 = pre->ray_space[k].vz.field_0.m128[1];
  fVar172 = pre->ray_space[k].vz.field_0.m128[2];
  fVar173 = pre->ray_space[k].vz.field_0.m128[3];
  auVar82._0_4_ = fVar69 * auVar321._0_4_;
  auVar82._4_4_ = fVar160 * auVar321._4_4_;
  auVar82._8_4_ = fVar172 * auVar321._8_4_;
  auVar82._12_4_ = fVar173 * auVar321._12_4_;
  auVar14 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar3,auVar85);
  local_3e8 = vsubps_avx(auVar162,auVar13);
  auVar85 = vshufps_avx(local_3e8,local_3e8,0x55);
  auVar321 = vshufps_avx(local_3e8,local_3e8,0xaa);
  auVar328._0_4_ = fVar69 * auVar321._0_4_;
  auVar328._4_4_ = fVar160 * auVar321._4_4_;
  auVar328._8_4_ = fVar172 * auVar321._8_4_;
  auVar328._12_4_ = fVar173 * auVar321._12_4_;
  auVar321 = vfmadd231ps_fma(auVar328,(undefined1  [16])aVar3,auVar85);
  local_2d8 = vsubps_avx(local_408,auVar13);
  auVar85 = vshufps_avx(local_2d8,local_2d8,0xaa);
  auVar320._0_4_ = fVar69 * auVar85._0_4_;
  auVar320._4_4_ = fVar160 * auVar85._4_4_;
  auVar320._8_4_ = fVar172 * auVar85._8_4_;
  auVar320._12_4_ = fVar173 * auVar85._12_4_;
  auVar85 = vshufps_avx(local_2d8,local_2d8,0x55);
  auVar15 = vfmadd231ps_fma(auVar320,(undefined1  [16])aVar3,auVar85);
  local_2e8 = vsubps_avx(auVar16,auVar13);
  auVar85 = vshufps_avx(local_2e8,local_2e8,0xaa);
  auVar303._0_4_ = fVar69 * auVar85._0_4_;
  auVar303._4_4_ = fVar160 * auVar85._4_4_;
  auVar303._8_4_ = fVar172 * auVar85._8_4_;
  auVar303._12_4_ = fVar173 * auVar85._12_4_;
  auVar85 = vshufps_avx(local_2e8,local_2e8,0x55);
  auVar182 = vfmadd231ps_fma(auVar303,(undefined1  [16])aVar3,auVar85);
  local_2f8 = vsubps_avx(_local_418,auVar13);
  auVar85 = vshufps_avx(local_2f8,local_2f8,0xaa);
  auVar147._0_4_ = fVar69 * auVar85._0_4_;
  auVar147._4_4_ = fVar160 * auVar85._4_4_;
  auVar147._8_4_ = fVar172 * auVar85._8_4_;
  auVar147._12_4_ = fVar173 * auVar85._12_4_;
  auVar85 = vshufps_avx(local_2f8,local_2f8,0x55);
  auVar258 = vfmadd231ps_fma(auVar147,(undefined1  [16])aVar3,auVar85);
  local_308 = vsubps_avx(auVar17,auVar13);
  auVar85 = vshufps_avx(local_308,local_308,0xaa);
  auVar212._0_4_ = fVar69 * auVar85._0_4_;
  auVar212._4_4_ = fVar160 * auVar85._4_4_;
  auVar212._8_4_ = fVar172 * auVar85._8_4_;
  auVar212._12_4_ = fVar173 * auVar85._12_4_;
  auVar85 = vshufps_avx(local_308,local_308,0x55);
  auVar73 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar3,auVar85);
  local_318 = vsubps_avx(auVar18,auVar13);
  auVar85 = vshufps_avx(local_318,local_318,0xaa);
  auVar249._0_4_ = fVar69 * auVar85._0_4_;
  auVar249._4_4_ = fVar160 * auVar85._4_4_;
  auVar249._8_4_ = fVar172 * auVar85._8_4_;
  auVar249._12_4_ = fVar173 * auVar85._12_4_;
  auVar85 = vshufps_avx(local_318,local_318,0x55);
  auVar85 = vfmadd231ps_fma(auVar249,(undefined1  [16])aVar3,auVar85);
  local_328 = vsubps_avx(auVar209,auVar13);
  auVar13 = vshufps_avx(local_328,local_328,0xaa);
  auVar164._0_4_ = fVar69 * auVar13._0_4_;
  auVar164._4_4_ = fVar160 * auVar13._4_4_;
  auVar164._8_4_ = fVar172 * auVar13._8_4_;
  auVar164._12_4_ = fVar173 * auVar13._12_4_;
  auVar13 = vshufps_avx(local_328,local_328,0x55);
  auVar13 = vfmadd231ps_fma(auVar164,(undefined1  [16])aVar3,auVar13);
  auVar185._4_4_ = local_3d8._0_4_;
  auVar185._0_4_ = local_3d8._0_4_;
  auVar185._8_4_ = local_3d8._0_4_;
  auVar185._12_4_ = local_3d8._0_4_;
  aVar3 = pre->ray_space[k].vx.field_0;
  auVar74 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar3,auVar185);
  auVar186._4_4_ = local_3e8._0_4_;
  auVar186._0_4_ = local_3e8._0_4_;
  auVar186._8_4_ = local_3e8._0_4_;
  auVar186._12_4_ = local_3e8._0_4_;
  auVar71 = vfmadd231ps_fma(auVar321,(undefined1  [16])aVar3,auVar186);
  uVar70 = local_2d8._0_4_;
  auVar187._4_4_ = uVar70;
  auVar187._0_4_ = uVar70;
  auVar187._8_4_ = uVar70;
  auVar187._12_4_ = uVar70;
  auVar72 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar3,auVar187);
  uVar70 = local_2e8._0_4_;
  auVar188._4_4_ = uVar70;
  auVar188._0_4_ = uVar70;
  auVar188._8_4_ = uVar70;
  auVar188._12_4_ = uVar70;
  auVar88 = vfmadd231ps_fma(auVar182,(undefined1  [16])aVar3,auVar188);
  uVar70 = local_2f8._0_4_;
  auVar189._4_4_ = uVar70;
  auVar189._0_4_ = uVar70;
  auVar189._8_4_ = uVar70;
  auVar189._12_4_ = uVar70;
  auVar258 = vfmadd231ps_fma(auVar258,(undefined1  [16])aVar3,auVar189);
  uVar70 = local_308._0_4_;
  auVar190._4_4_ = uVar70;
  auVar190._0_4_ = uVar70;
  auVar190._8_4_ = uVar70;
  auVar190._12_4_ = uVar70;
  auVar73 = vfmadd231ps_fma(auVar73,(undefined1  [16])aVar3,auVar190);
  uVar70 = local_318._0_4_;
  auVar191._4_4_ = uVar70;
  auVar191._0_4_ = uVar70;
  auVar191._8_4_ = uVar70;
  auVar191._12_4_ = uVar70;
  auVar89 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar3,auVar191);
  uVar70 = local_328._0_4_;
  auVar192._4_4_ = uVar70;
  auVar192._0_4_ = uVar70;
  auVar192._8_4_ = uVar70;
  auVar192._12_4_ = uVar70;
  auVar90 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar3,auVar192);
  auVar14 = vmovlhps_avx(auVar74,auVar258);
  auVar15 = vmovlhps_avx(auVar71,auVar73);
  auVar182 = vmovlhps_avx(auVar72,auVar89);
  _local_3c8 = vmovlhps_avx(auVar88,auVar90);
  auVar13 = vminps_avx(auVar14,auVar15);
  auVar85 = vminps_avx(auVar182,_local_3c8);
  auVar321 = vminps_avx(auVar13,auVar85);
  auVar13 = vmaxps_avx(auVar14,auVar15);
  auVar85 = vmaxps_avx(auVar182,_local_3c8);
  auVar13 = vmaxps_avx(auVar13,auVar85);
  auVar85 = vshufpd_avx(auVar321,auVar321,3);
  auVar321 = vminps_avx(auVar321,auVar85);
  auVar85 = vshufpd_avx(auVar13,auVar13,3);
  auVar85 = vmaxps_avx(auVar13,auVar85);
  auVar13 = vandps_avx(auVar321,auVar327);
  auVar85 = vandps_avx(auVar85,auVar327);
  auVar13 = vmaxps_avx(auVar13,auVar85);
  auVar85 = vmovshdup_avx(auVar13);
  auVar13 = vmaxss_avx(auVar85,auVar13);
  local_198 = auVar13._0_4_ * 9.536743e-07;
  auVar193._8_8_ = auVar74._0_8_;
  auVar193._0_8_ = auVar74._0_8_;
  auVar230._8_8_ = auVar71._0_8_;
  auVar230._0_8_ = auVar71._0_8_;
  auVar262._8_8_ = auVar72._0_8_;
  auVar262._0_8_ = auVar72._0_8_;
  auVar304._0_8_ = auVar88._0_8_;
  auVar304._8_8_ = auVar304._0_8_;
  local_2c8 = ZEXT416((uint)local_198);
  fStack_194 = local_198;
  fStack_190 = local_198;
  fStack_18c = local_198;
  fStack_188 = local_198;
  fStack_184 = local_198;
  fStack_180 = local_198;
  fStack_17c = local_198;
  local_1b8 = -local_198;
  fStack_1b4 = local_1b8;
  fStack_1b0 = local_1b8;
  fStack_1ac = local_1b8;
  fStack_1a8 = local_1b8;
  fStack_1a4 = local_1b8;
  fStack_1a0 = local_1b8;
  fStack_19c = local_1b8;
  local_398 = uVar61;
  uStack_394 = uVar61;
  uStack_390 = uVar61;
  uStack_38c = uVar61;
  local_3a8 = uVar5;
  uStack_3a4 = uVar5;
  uStack_3a0 = uVar5;
  uStack_39c = uVar5;
  uVar62 = 0;
  fVar69 = *(float *)(ray + k * 4 + 0x30);
  local_298 = vsubps_avx(auVar15,auVar14);
  local_2a8 = vsubps_avx(auVar182,auVar15);
  local_2b8 = vsubps_avx(_local_3c8,auVar182);
  local_348 = vsubps_avx(_local_418,local_3f8);
  local_358 = vsubps_avx(auVar17,auVar162);
  local_368 = vsubps_avx(auVar18,local_408);
  _local_378 = vsubps_avx(auVar209,auVar16);
  local_668 = ZEXT816(0x3f80000000000000);
  local_338 = local_668;
  do {
    auVar13 = vshufps_avx(local_668,local_668,0x50);
    auVar132._8_4_ = 0x3f800000;
    auVar132._0_8_ = &DAT_3f8000003f800000;
    auVar132._12_4_ = 0x3f800000;
    auVar138._16_4_ = 0x3f800000;
    auVar138._0_16_ = auVar132;
    auVar138._20_4_ = 0x3f800000;
    auVar138._24_4_ = 0x3f800000;
    auVar138._28_4_ = 0x3f800000;
    auVar85 = vsubps_avx(auVar132,auVar13);
    fVar160 = auVar13._0_4_;
    fVar128 = auVar258._0_4_;
    auVar83._0_4_ = fVar128 * fVar160;
    fVar172 = auVar13._4_4_;
    fVar141 = auVar258._4_4_;
    auVar83._4_4_ = fVar141 * fVar172;
    fVar173 = auVar13._8_4_;
    auVar83._8_4_ = fVar128 * fVar173;
    fVar174 = auVar13._12_4_;
    auVar83._12_4_ = fVar141 * fVar174;
    fVar206 = auVar73._0_4_;
    auVar165._0_4_ = fVar206 * fVar160;
    fVar224 = auVar73._4_4_;
    auVar165._4_4_ = fVar224 * fVar172;
    auVar165._8_4_ = fVar206 * fVar173;
    auVar165._12_4_ = fVar224 * fVar174;
    fVar242 = auVar89._0_4_;
    auVar213._0_4_ = fVar242 * fVar160;
    fVar255 = auVar89._4_4_;
    auVar213._4_4_ = fVar255 * fVar172;
    auVar213._8_4_ = fVar242 * fVar173;
    auVar213._12_4_ = fVar255 * fVar174;
    fVar315 = auVar90._0_4_;
    auVar291._0_4_ = fVar315 * fVar160;
    fVar326 = auVar90._4_4_;
    auVar291._4_4_ = fVar326 * fVar172;
    auVar291._8_4_ = fVar315 * fVar173;
    auVar291._12_4_ = fVar326 * fVar174;
    auVar71 = vfmadd231ps_fma(auVar83,auVar85,auVar193);
    auVar72 = vfmadd231ps_fma(auVar165,auVar85,auVar230);
    auVar88 = vfmadd231ps_fma(auVar213,auVar85,auVar262);
    auVar233 = vfmadd231ps_fma(auVar291,auVar304,auVar85);
    local_5c8 = auVar233._0_4_;
    auVar13 = vmovshdup_avx(local_338);
    fVar160 = local_338._0_4_;
    fVar111 = (auVar13._0_4_ - fVar160) * 0.04761905;
    auVar241._4_4_ = fVar160;
    auVar241._0_4_ = fVar160;
    auVar241._8_4_ = fVar160;
    auVar241._12_4_ = fVar160;
    auVar241._16_4_ = fVar160;
    auVar241._20_4_ = fVar160;
    auVar241._24_4_ = fVar160;
    auVar241._28_4_ = fVar160;
    auVar122._0_8_ = auVar13._0_8_;
    auVar122._8_8_ = auVar122._0_8_;
    auVar122._16_8_ = auVar122._0_8_;
    auVar122._24_8_ = auVar122._0_8_;
    auVar87 = vsubps_avx(auVar122,auVar241);
    uVar70 = auVar71._0_4_;
    auVar332._4_4_ = uVar70;
    auVar332._0_4_ = uVar70;
    auVar332._8_4_ = uVar70;
    auVar332._12_4_ = uVar70;
    auVar332._16_4_ = uVar70;
    auVar332._20_4_ = uVar70;
    auVar332._24_4_ = uVar70;
    auVar332._28_4_ = uVar70;
    auVar13 = vmovshdup_avx(auVar71);
    uVar177 = auVar13._0_8_;
    auVar313._8_8_ = uVar177;
    auVar313._0_8_ = uVar177;
    auVar313._16_8_ = uVar177;
    auVar313._24_8_ = uVar177;
    fVar125 = auVar72._0_4_;
    auVar108._4_4_ = fVar125;
    auVar108._0_4_ = fVar125;
    auVar108._8_4_ = fVar125;
    auVar108._12_4_ = fVar125;
    auVar108._16_4_ = fVar125;
    auVar108._20_4_ = fVar125;
    auVar108._24_4_ = fVar125;
    auVar108._28_4_ = fVar125;
    auVar85 = vmovshdup_avx(auVar72);
    auVar197._0_8_ = auVar85._0_8_;
    auVar197._8_8_ = auVar197._0_8_;
    auVar197._16_8_ = auVar197._0_8_;
    auVar197._24_8_ = auVar197._0_8_;
    fVar142 = auVar88._0_4_;
    auVar286._4_4_ = fVar142;
    auVar286._0_4_ = fVar142;
    auVar286._8_4_ = fVar142;
    auVar286._12_4_ = fVar142;
    auVar286._16_4_ = fVar142;
    auVar286._20_4_ = fVar142;
    auVar286._24_4_ = fVar142;
    auVar286._28_4_ = fVar142;
    auVar321 = vmovshdup_avx(auVar88);
    auVar254._0_8_ = auVar321._0_8_;
    auVar254._8_8_ = auVar254._0_8_;
    auVar254._16_8_ = auVar254._0_8_;
    auVar254._24_8_ = auVar254._0_8_;
    auVar74 = vmovshdup_avx(auVar233);
    auVar112 = vfmadd132ps_fma(auVar87,auVar241,_DAT_02020f20);
    auVar87 = vsubps_avx(auVar138,ZEXT1632(auVar112));
    fVar160 = auVar112._0_4_;
    auVar323._0_4_ = fVar125 * fVar160;
    fVar172 = auVar112._4_4_;
    auVar323._4_4_ = fVar125 * fVar172;
    fVar173 = auVar112._8_4_;
    auVar323._8_4_ = fVar125 * fVar173;
    fVar174 = auVar112._12_4_;
    auVar323._12_4_ = fVar125 * fVar174;
    auVar323._16_4_ = fVar125 * 0.0;
    auVar323._20_4_ = fVar125 * 0.0;
    auVar323._24_4_ = fVar125 * 0.0;
    auVar323._28_4_ = 0;
    auVar112 = vfmadd231ps_fma(auVar323,auVar87,auVar332);
    fVar126 = auVar85._0_4_;
    auVar298._0_4_ = fVar126 * fVar160;
    fVar127 = auVar85._4_4_;
    auVar298._4_4_ = fVar127 * fVar172;
    auVar298._8_4_ = fVar126 * fVar173;
    auVar298._12_4_ = fVar127 * fVar174;
    auVar298._16_4_ = fVar126 * 0.0;
    auVar298._20_4_ = fVar127 * 0.0;
    auVar298._24_4_ = fVar126 * 0.0;
    auVar298._28_4_ = 0;
    auVar113 = vfmadd231ps_fma(auVar298,auVar87,auVar313);
    auVar19._4_4_ = fVar142 * fVar172;
    auVar19._0_4_ = fVar142 * fVar160;
    auVar19._8_4_ = fVar142 * fVar173;
    auVar19._12_4_ = fVar142 * fVar174;
    auVar19._16_4_ = fVar142 * 0.0;
    auVar19._20_4_ = fVar142 * 0.0;
    auVar19._24_4_ = fVar142 * 0.0;
    auVar19._28_4_ = auVar13._4_4_;
    auVar114 = vfmadd231ps_fma(auVar19,auVar87,auVar108);
    fVar126 = auVar321._0_4_;
    fVar127 = auVar321._4_4_;
    auVar20._4_4_ = fVar127 * fVar172;
    auVar20._0_4_ = fVar126 * fVar160;
    auVar20._8_4_ = fVar126 * fVar173;
    auVar20._12_4_ = fVar127 * fVar174;
    auVar20._16_4_ = fVar126 * 0.0;
    auVar20._20_4_ = fVar127 * 0.0;
    auVar20._24_4_ = fVar126 * 0.0;
    auVar20._28_4_ = uVar70;
    auVar150 = vfmadd231ps_fma(auVar20,auVar87,auVar197);
    auVar13 = vshufps_avx(auVar71,auVar71,0xaa);
    auVar198._0_8_ = auVar13._0_8_;
    auVar198._8_8_ = auVar198._0_8_;
    auVar198._16_8_ = auVar198._0_8_;
    auVar198._24_8_ = auVar198._0_8_;
    auVar85 = vshufps_avx(auVar71,auVar71,0xff);
    uStack_5e0 = auVar85._0_8_;
    local_5e8 = (undefined1  [8])uStack_5e0;
    uStack_5d8 = uStack_5e0;
    uStack_5d0 = uStack_5e0;
    auVar21._4_4_ = fVar172 * local_5c8;
    auVar21._0_4_ = fVar160 * local_5c8;
    auVar21._8_4_ = fVar173 * local_5c8;
    auVar21._12_4_ = fVar174 * local_5c8;
    auVar21._16_4_ = local_5c8 * 0.0;
    auVar21._20_4_ = local_5c8 * 0.0;
    auVar21._24_4_ = local_5c8 * 0.0;
    auVar21._28_4_ = 0x3f800000;
    auVar161 = vfmadd231ps_fma(auVar21,auVar87,auVar286);
    auVar321 = vshufps_avx(auVar72,auVar72,0xaa);
    auVar158._0_8_ = auVar321._0_8_;
    auVar158._8_8_ = auVar158._0_8_;
    auVar158._16_8_ = auVar158._0_8_;
    auVar158._24_8_ = auVar158._0_8_;
    auVar71 = vshufps_avx(auVar72,auVar72,0xff);
    auVar171._0_8_ = auVar71._0_8_;
    auVar171._8_8_ = auVar171._0_8_;
    auVar171._16_8_ = auVar171._0_8_;
    auVar171._24_8_ = auVar171._0_8_;
    fVar126 = auVar74._0_4_;
    fVar127 = auVar74._4_4_;
    auVar22._4_4_ = fVar127 * fVar172;
    auVar22._0_4_ = fVar126 * fVar160;
    auVar22._8_4_ = fVar126 * fVar173;
    auVar22._12_4_ = fVar127 * fVar174;
    auVar22._16_4_ = fVar126 * 0.0;
    auVar22._20_4_ = fVar127 * 0.0;
    auVar22._24_4_ = fVar126 * 0.0;
    auVar22._28_4_ = fVar142;
    auVar178 = vfmadd231ps_fma(auVar22,auVar87,auVar254);
    auVar23._28_4_ = fVar125;
    auVar23._0_28_ =
         ZEXT1628(CONCAT412(auVar114._12_4_ * fVar174,
                            CONCAT48(auVar114._8_4_ * fVar173,
                                     CONCAT44(auVar114._4_4_ * fVar172,auVar114._0_4_ * fVar160))));
    auVar112 = vfmadd231ps_fma(auVar23,auVar87,ZEXT1632(auVar112));
    auVar24._28_4_ = auVar85._4_4_;
    auVar24._0_28_ =
         ZEXT1628(CONCAT412(auVar150._12_4_ * fVar174,
                            CONCAT48(auVar150._8_4_ * fVar173,
                                     CONCAT44(auVar150._4_4_ * fVar172,auVar150._0_4_ * fVar160))));
    auVar113 = vfmadd231ps_fma(auVar24,auVar87,ZEXT1632(auVar113));
    auVar85 = vshufps_avx(auVar88,auVar88,0xaa);
    uVar177 = auVar85._0_8_;
    auVar299._8_8_ = uVar177;
    auVar299._0_8_ = uVar177;
    auVar299._16_8_ = uVar177;
    auVar299._24_8_ = uVar177;
    auVar74 = vshufps_avx(auVar88,auVar88,0xff);
    uVar177 = auVar74._0_8_;
    auVar324._8_8_ = uVar177;
    auVar324._0_8_ = uVar177;
    auVar324._16_8_ = uVar177;
    auVar324._24_8_ = uVar177;
    auVar114 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar174 * auVar161._12_4_,
                                                  CONCAT48(fVar173 * auVar161._8_4_,
                                                           CONCAT44(fVar172 * auVar161._4_4_,
                                                                    fVar160 * auVar161._0_4_)))),
                               auVar87,ZEXT1632(auVar114));
    auVar72 = vshufps_avx(auVar233,auVar233,0xaa);
    auVar88 = vshufps_avx(auVar233,auVar233,0xff);
    local_5c8 = auVar88._0_4_;
    fStack_5c4 = auVar88._4_4_;
    auVar25._28_4_ = fStack_5c4;
    auVar25._0_28_ =
         ZEXT1628(CONCAT412(auVar178._12_4_ * fVar174,
                            CONCAT48(auVar178._8_4_ * fVar173,
                                     CONCAT44(auVar178._4_4_ * fVar172,auVar178._0_4_ * fVar160))));
    auVar88 = vfmadd231ps_fma(auVar25,auVar87,ZEXT1632(auVar150));
    auVar233 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar174 * auVar114._12_4_,
                                                  CONCAT48(fVar173 * auVar114._8_4_,
                                                           CONCAT44(fVar172 * auVar114._4_4_,
                                                                    fVar160 * auVar114._0_4_)))),
                               auVar87,ZEXT1632(auVar112));
    auVar19 = vsubps_avx(ZEXT1632(auVar114),ZEXT1632(auVar112));
    auVar112 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar174 * auVar88._12_4_,
                                                  CONCAT48(fVar173 * auVar88._8_4_,
                                                           CONCAT44(fVar172 * auVar88._4_4_,
                                                                    fVar160 * auVar88._0_4_)))),
                               auVar87,ZEXT1632(auVar113));
    auVar20 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar113));
    fVar256 = fVar111 * auVar19._0_4_ * 3.0;
    fVar271 = fVar111 * auVar19._4_4_ * 3.0;
    auVar26._4_4_ = fVar271;
    auVar26._0_4_ = fVar256;
    fVar272 = fVar111 * auVar19._8_4_ * 3.0;
    auVar26._8_4_ = fVar272;
    fVar273 = fVar111 * auVar19._12_4_ * 3.0;
    auVar26._12_4_ = fVar273;
    fVar274 = fVar111 * auVar19._16_4_ * 3.0;
    auVar26._16_4_ = fVar274;
    fVar275 = fVar111 * auVar19._20_4_ * 3.0;
    auVar26._20_4_ = fVar275;
    fVar276 = fVar111 * auVar19._24_4_ * 3.0;
    auVar26._24_4_ = fVar276;
    auVar26._28_4_ = 0x40400000;
    local_608._0_4_ = fVar111 * auVar20._0_4_ * 3.0;
    local_608._4_4_ = fVar111 * auVar20._4_4_ * 3.0;
    fStack_600 = fVar111 * auVar20._8_4_ * 3.0;
    fStack_5fc = fVar111 * auVar20._12_4_ * 3.0;
    fStack_5f8 = fVar111 * auVar20._16_4_ * 3.0;
    fStack_5f4 = fVar111 * auVar20._20_4_ * 3.0;
    fStack_5f0 = fVar111 * auVar20._24_4_ * 3.0;
    fStack_5ec = auVar20._28_4_;
    fVar125 = auVar321._0_4_;
    fVar126 = auVar321._4_4_;
    auVar300._4_4_ = fVar126 * fVar172;
    auVar300._0_4_ = fVar125 * fVar160;
    auVar300._8_4_ = fVar125 * fVar173;
    auVar300._12_4_ = fVar126 * fVar174;
    auVar300._16_4_ = fVar125 * 0.0;
    auVar300._20_4_ = fVar126 * 0.0;
    auVar300._24_4_ = fVar125 * 0.0;
    auVar300._28_4_ = auVar19._28_4_;
    auVar321 = vfmadd231ps_fma(auVar300,auVar87,auVar198);
    fVar125 = auVar71._0_4_;
    fVar127 = auVar71._4_4_;
    auVar28._4_4_ = fVar127 * fVar172;
    auVar28._0_4_ = fVar125 * fVar160;
    auVar28._8_4_ = fVar125 * fVar173;
    auVar28._12_4_ = fVar127 * fVar174;
    auVar28._16_4_ = fVar125 * 0.0;
    auVar28._20_4_ = fVar127 * 0.0;
    auVar28._24_4_ = fVar125 * 0.0;
    auVar28._28_4_ = auVar13._4_4_;
    auVar13 = vfmadd231ps_fma(auVar28,auVar87,_local_5e8);
    fVar125 = auVar85._0_4_;
    fVar127 = auVar85._4_4_;
    auVar29._4_4_ = fVar127 * fVar172;
    auVar29._0_4_ = fVar125 * fVar160;
    auVar29._8_4_ = fVar125 * fVar173;
    auVar29._12_4_ = fVar127 * fVar174;
    auVar29._16_4_ = fVar125 * 0.0;
    auVar29._20_4_ = fVar127 * 0.0;
    auVar29._24_4_ = fVar125 * 0.0;
    auVar29._28_4_ = fVar111;
    auVar85 = vfmadd231ps_fma(auVar29,auVar87,auVar158);
    fVar125 = auVar74._0_4_;
    fVar142 = auVar74._4_4_;
    auVar30._4_4_ = fVar142 * fVar172;
    auVar30._0_4_ = fVar125 * fVar160;
    auVar30._8_4_ = fVar125 * fVar173;
    auVar30._12_4_ = fVar142 * fVar174;
    auVar30._16_4_ = fVar125 * 0.0;
    auVar30._20_4_ = fVar142 * 0.0;
    auVar30._24_4_ = fVar125 * 0.0;
    auVar30._28_4_ = fVar126;
    auVar74 = vfmadd231ps_fma(auVar30,auVar87,auVar171);
    auVar23 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar233));
    fVar125 = auVar72._0_4_;
    fVar126 = auVar72._4_4_;
    auVar31._4_4_ = fVar126 * fVar172;
    auVar31._0_4_ = fVar125 * fVar160;
    auVar31._8_4_ = fVar125 * fVar173;
    auVar31._12_4_ = fVar126 * fVar174;
    auVar31._16_4_ = fVar125 * 0.0;
    auVar31._20_4_ = fVar126 * 0.0;
    auVar31._24_4_ = fVar125 * 0.0;
    auVar31._28_4_ = auVar23._28_4_;
    auVar71 = vfmadd231ps_fma(auVar31,auVar87,auVar299);
    auVar24 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar112));
    auVar32._4_4_ = fVar172 * fStack_5c4;
    auVar32._0_4_ = fVar160 * local_5c8;
    auVar32._8_4_ = fVar173 * local_5c8;
    auVar32._12_4_ = fVar174 * fStack_5c4;
    auVar32._16_4_ = local_5c8 * 0.0;
    auVar32._20_4_ = fStack_5c4 * 0.0;
    auVar32._24_4_ = local_5c8 * 0.0;
    auVar32._28_4_ = fVar127;
    auVar72 = vfmadd231ps_fma(auVar32,auVar87,auVar324);
    auVar33._28_4_ = fVar126;
    auVar33._0_28_ =
         ZEXT1628(CONCAT412(fVar174 * auVar85._12_4_,
                            CONCAT48(fVar173 * auVar85._8_4_,
                                     CONCAT44(fVar172 * auVar85._4_4_,fVar160 * auVar85._0_4_))));
    auVar321 = vfmadd231ps_fma(auVar33,auVar87,ZEXT1632(auVar321));
    auVar13 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar174 * auVar74._12_4_,
                                                 CONCAT48(fVar173 * auVar74._8_4_,
                                                          CONCAT44(fVar172 * auVar74._4_4_,
                                                                   fVar160 * auVar74._0_4_)))),
                              auVar87,ZEXT1632(auVar13));
    fVar256 = auVar233._0_4_ + fVar256;
    fVar271 = auVar233._4_4_ + fVar271;
    fVar272 = auVar233._8_4_ + fVar272;
    fVar273 = auVar233._12_4_ + fVar273;
    fVar274 = fVar274 + 0.0;
    fVar275 = fVar275 + 0.0;
    fVar276 = fVar276 + 0.0;
    auVar34._28_4_ = 0x40400000;
    auVar34._0_28_ =
         ZEXT1628(CONCAT412(auVar72._12_4_ * fVar174,
                            CONCAT48(auVar72._8_4_ * fVar173,
                                     CONCAT44(auVar72._4_4_ * fVar172,auVar72._0_4_ * fVar160))));
    auVar85 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar174 * auVar71._12_4_,
                                                 CONCAT48(fVar173 * auVar71._8_4_,
                                                          CONCAT44(fVar172 * auVar71._4_4_,
                                                                   fVar160 * auVar71._0_4_)))),
                              auVar87,ZEXT1632(auVar85));
    auVar74 = vfmadd231ps_fma(auVar34,auVar87,ZEXT1632(auVar74));
    auVar71 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar174 * auVar85._12_4_,
                                                 CONCAT48(fVar173 * auVar85._8_4_,
                                                          CONCAT44(fVar172 * auVar85._4_4_,
                                                                   fVar160 * auVar85._0_4_)))),
                              auVar87,ZEXT1632(auVar321));
    auVar72 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar174 * auVar74._12_4_,
                                                 CONCAT48(fVar173 * auVar74._8_4_,
                                                          CONCAT44(fVar172 * auVar74._4_4_,
                                                                   fVar160 * auVar74._0_4_)))),
                              ZEXT1632(auVar13),auVar87);
    auVar87 = vsubps_avx(ZEXT1632(auVar85),ZEXT1632(auVar321));
    auVar19 = vsubps_avx(ZEXT1632(auVar74),ZEXT1632(auVar13));
    fVar160 = fVar111 * auVar87._0_4_ * 3.0;
    fVar172 = fVar111 * auVar87._4_4_ * 3.0;
    auVar35._4_4_ = fVar172;
    auVar35._0_4_ = fVar160;
    fVar173 = fVar111 * auVar87._8_4_ * 3.0;
    auVar35._8_4_ = fVar173;
    fVar174 = fVar111 * auVar87._12_4_ * 3.0;
    auVar35._12_4_ = fVar174;
    fVar142 = fVar111 * auVar87._16_4_ * 3.0;
    auVar35._16_4_ = fVar142;
    fVar143 = fVar111 * auVar87._20_4_ * 3.0;
    auVar35._20_4_ = fVar143;
    fVar175 = fVar111 * auVar87._24_4_ * 3.0;
    auVar35._24_4_ = fVar175;
    auVar35._28_4_ = 0x40400000;
    auVar223._0_4_ = fVar111 * auVar19._0_4_ * 3.0;
    auVar223._4_4_ = fVar111 * auVar19._4_4_ * 3.0;
    auVar223._8_4_ = fVar111 * auVar19._8_4_ * 3.0;
    auVar223._12_4_ = fVar111 * auVar19._12_4_ * 3.0;
    auVar223._16_4_ = fVar111 * auVar19._16_4_ * 3.0;
    auVar223._20_4_ = fVar111 * auVar19._20_4_ * 3.0;
    auVar223._24_4_ = fVar111 * auVar19._24_4_ * 3.0;
    auVar223._28_4_ = 0;
    auVar25 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar71));
    local_78 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar72));
    auVar87 = vsubps_avx(ZEXT1632(auVar71),ZEXT1632(auVar233));
    auVar19 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar112));
    auVar21 = vsubps_avx(auVar25,auVar23);
    fVar176 = auVar87._0_4_ + auVar21._0_4_;
    fVar200 = auVar87._4_4_ + auVar21._4_4_;
    fVar201 = auVar87._8_4_ + auVar21._8_4_;
    fVar202 = auVar87._12_4_ + auVar21._12_4_;
    fVar203 = auVar87._16_4_ + auVar21._16_4_;
    fVar204 = auVar87._20_4_ + auVar21._20_4_;
    fVar205 = auVar87._24_4_ + auVar21._24_4_;
    auVar22 = vsubps_avx(local_78,auVar24);
    auVar314._0_4_ = auVar19._0_4_ + auVar22._0_4_;
    auVar314._4_4_ = auVar19._4_4_ + auVar22._4_4_;
    auVar314._8_4_ = auVar19._8_4_ + auVar22._8_4_;
    auVar314._12_4_ = auVar19._12_4_ + auVar22._12_4_;
    auVar314._16_4_ = auVar19._16_4_ + auVar22._16_4_;
    auVar314._20_4_ = auVar19._20_4_ + auVar22._20_4_;
    auVar314._24_4_ = auVar19._24_4_ + auVar22._24_4_;
    auVar314._28_4_ = auVar19._28_4_ + auVar22._28_4_;
    fVar111 = auVar112._0_4_;
    local_158 = fVar111 + (float)local_608._0_4_;
    fVar125 = auVar112._4_4_;
    fStack_154 = fVar125 + (float)local_608._4_4_;
    fVar126 = auVar112._8_4_;
    fStack_150 = fVar126 + fStack_600;
    fVar127 = auVar112._12_4_;
    fStack_14c = fVar127 + fStack_5fc;
    fStack_148 = fStack_5f8 + 0.0;
    fStack_144 = fStack_5f4 + 0.0;
    fStack_140 = fStack_5f0 + 0.0;
    fStack_13c = auVar20._28_4_ + 0.0;
    local_98 = ZEXT1632(auVar233);
    auVar19 = vsubps_avx(local_98,auVar26);
    local_d8 = vpermps_avx2(_DAT_0205d4a0,auVar19);
    local_b8 = ZEXT1632(auVar112);
    auVar19 = vsubps_avx(local_b8,_local_608);
    local_178 = vpermps_avx2(_DAT_0205d4a0,auVar19);
    local_f8._0_4_ = auVar71._0_4_ + fVar160;
    local_f8._4_4_ = auVar71._4_4_ + fVar172;
    local_f8._8_4_ = auVar71._8_4_ + fVar173;
    local_f8._12_4_ = auVar71._12_4_ + fVar174;
    local_f8._16_4_ = fVar142 + 0.0;
    local_f8._20_4_ = fVar143 + 0.0;
    local_f8._24_4_ = fVar175 + 0.0;
    local_f8._28_4_ = 0x40400000;
    auVar300 = ZEXT1632(auVar71);
    auVar19 = vsubps_avx(auVar300,auVar35);
    auVar26 = vpermps_avx2(_DAT_0205d4a0,auVar19);
    fVar160 = auVar72._0_4_;
    local_138._0_4_ = fVar160 + auVar223._0_4_;
    fVar172 = auVar72._4_4_;
    local_138._4_4_ = fVar172 + auVar223._4_4_;
    fVar173 = auVar72._8_4_;
    local_138._8_4_ = fVar173 + auVar223._8_4_;
    fVar174 = auVar72._12_4_;
    local_138._12_4_ = fVar174 + auVar223._12_4_;
    local_138._16_4_ = auVar223._16_4_ + 0.0;
    local_138._20_4_ = auVar223._20_4_ + 0.0;
    local_138._24_4_ = auVar223._24_4_ + 0.0;
    local_138._28_4_ = 0;
    auVar19 = vsubps_avx(ZEXT1632(auVar72),auVar223);
    local_118 = vpermps_avx2(_DAT_0205d4a0,auVar19);
    auVar36._4_4_ = fVar125 * fVar200;
    auVar36._0_4_ = fVar111 * fVar176;
    auVar36._8_4_ = fVar126 * fVar201;
    auVar36._12_4_ = fVar127 * fVar202;
    auVar36._16_4_ = fVar203 * 0.0;
    auVar36._20_4_ = fVar204 * 0.0;
    auVar36._24_4_ = fVar205 * 0.0;
    auVar36._28_4_ = auVar19._28_4_;
    auVar13 = vfnmadd231ps_fma(auVar36,local_98,auVar314);
    auVar37._4_4_ = fStack_154 * fVar200;
    auVar37._0_4_ = local_158 * fVar176;
    auVar37._8_4_ = fStack_150 * fVar201;
    auVar37._12_4_ = fStack_14c * fVar202;
    auVar37._16_4_ = fStack_148 * fVar203;
    auVar37._20_4_ = fStack_144 * fVar204;
    auVar37._24_4_ = fStack_140 * fVar205;
    auVar37._28_4_ = auVar26._28_4_;
    auVar51._4_4_ = fVar271;
    auVar51._0_4_ = fVar256;
    auVar51._8_4_ = fVar272;
    auVar51._12_4_ = fVar273;
    auVar51._16_4_ = fVar274;
    auVar51._20_4_ = fVar275;
    auVar51._24_4_ = fVar276;
    auVar51._28_4_ = 0x40400000;
    auVar85 = vfnmadd231ps_fma(auVar37,auVar314,auVar51);
    auVar38._4_4_ = local_178._4_4_ * fVar200;
    auVar38._0_4_ = local_178._0_4_ * fVar176;
    auVar38._8_4_ = local_178._8_4_ * fVar201;
    auVar38._12_4_ = local_178._12_4_ * fVar202;
    auVar38._16_4_ = local_178._16_4_ * fVar203;
    auVar38._20_4_ = local_178._20_4_ * fVar204;
    auVar38._24_4_ = local_178._24_4_ * fVar205;
    auVar38._28_4_ = fStack_13c;
    auVar321 = vfnmadd231ps_fma(auVar38,local_d8,auVar314);
    local_5e8._0_4_ = auVar24._0_4_;
    local_5e8._4_4_ = auVar24._4_4_;
    uStack_5e0._0_4_ = auVar24._8_4_;
    uStack_5e0._4_4_ = auVar24._12_4_;
    uStack_5d8._0_4_ = auVar24._16_4_;
    uStack_5d8._4_4_ = auVar24._20_4_;
    uStack_5d0._0_4_ = auVar24._24_4_;
    auVar39._4_4_ = fVar200 * (float)local_5e8._4_4_;
    auVar39._0_4_ = fVar176 * (float)local_5e8._0_4_;
    auVar39._8_4_ = fVar201 * (float)uStack_5e0;
    auVar39._12_4_ = fVar202 * uStack_5e0._4_4_;
    auVar39._16_4_ = fVar203 * (float)uStack_5d8;
    auVar39._20_4_ = fVar204 * uStack_5d8._4_4_;
    auVar39._24_4_ = fVar205 * (float)uStack_5d0;
    auVar39._28_4_ = local_178._28_4_;
    auVar74 = vfnmadd231ps_fma(auVar39,auVar23,auVar314);
    auVar57._4_4_ = fVar172 * fVar200;
    auVar57._0_4_ = fVar160 * fVar176;
    auVar57._8_4_ = fVar173 * fVar201;
    auVar57._12_4_ = fVar174 * fVar202;
    auVar57._16_4_ = fVar203 * 0.0;
    auVar57._20_4_ = fVar204 * 0.0;
    auVar57._24_4_ = fVar205 * 0.0;
    auVar57._28_4_ = DAT_0205d4a0._28_4_;
    auVar71 = vfnmadd231ps_fma(auVar57,auVar300,auVar314);
    auVar40._4_4_ = local_138._4_4_ * fVar200;
    auVar40._0_4_ = local_138._0_4_ * fVar176;
    auVar40._8_4_ = local_138._8_4_ * fVar201;
    auVar40._12_4_ = local_138._12_4_ * fVar202;
    auVar40._16_4_ = local_138._16_4_ * fVar203;
    auVar40._20_4_ = local_138._20_4_ * fVar204;
    auVar40._24_4_ = local_138._24_4_ * fVar205;
    auVar40._28_4_ = auVar23._28_4_;
    auVar88 = vfnmadd231ps_fma(auVar40,local_f8,auVar314);
    auVar41._4_4_ = local_118._4_4_ * fVar200;
    auVar41._0_4_ = local_118._0_4_ * fVar176;
    auVar41._8_4_ = local_118._8_4_ * fVar201;
    auVar41._12_4_ = local_118._12_4_ * fVar202;
    auVar41._16_4_ = local_118._16_4_ * fVar203;
    auVar41._20_4_ = local_118._20_4_ * fVar204;
    auVar41._24_4_ = local_118._24_4_ * fVar205;
    auVar41._28_4_ = local_d8._28_4_;
    auVar233 = vfnmadd231ps_fma(auVar41,auVar314,auVar26);
    auVar42._4_4_ = local_78._4_4_ * fVar200;
    auVar42._0_4_ = local_78._0_4_ * fVar176;
    auVar42._8_4_ = local_78._8_4_ * fVar201;
    auVar42._12_4_ = local_78._12_4_ * fVar202;
    auVar42._16_4_ = local_78._16_4_ * fVar203;
    auVar42._20_4_ = local_78._20_4_ * fVar204;
    auVar42._24_4_ = local_78._24_4_ * fVar205;
    auVar42._28_4_ = auVar87._28_4_ + auVar21._28_4_;
    auVar112 = vfnmadd231ps_fma(auVar42,auVar314,auVar25);
    auVar19 = vminps_avx(ZEXT1632(auVar13),ZEXT1632(auVar85));
    auVar87 = vmaxps_avx(ZEXT1632(auVar13),ZEXT1632(auVar85));
    auVar20 = vminps_avx(ZEXT1632(auVar321),ZEXT1632(auVar74));
    auVar20 = vminps_avx(auVar19,auVar20);
    auVar19 = vmaxps_avx(ZEXT1632(auVar321),ZEXT1632(auVar74));
    auVar87 = vmaxps_avx(auVar87,auVar19);
    auVar21 = vminps_avx(ZEXT1632(auVar71),ZEXT1632(auVar88));
    auVar19 = vmaxps_avx(ZEXT1632(auVar71),ZEXT1632(auVar88));
    auVar22 = vminps_avx(ZEXT1632(auVar233),ZEXT1632(auVar112));
    auVar21 = vminps_avx(auVar21,auVar22);
    auVar21 = vminps_avx(auVar20,auVar21);
    auVar20 = vmaxps_avx(ZEXT1632(auVar233),ZEXT1632(auVar112));
    auVar19 = vmaxps_avx(auVar19,auVar20);
    auVar19 = vmaxps_avx(auVar87,auVar19);
    auVar56._4_4_ = fStack_194;
    auVar56._0_4_ = local_198;
    auVar56._8_4_ = fStack_190;
    auVar56._12_4_ = fStack_18c;
    auVar56._16_4_ = fStack_188;
    auVar56._20_4_ = fStack_184;
    auVar56._24_4_ = fStack_180;
    auVar56._28_4_ = fStack_17c;
    auVar87 = vcmpps_avx(auVar21,auVar56,2);
    auVar55._4_4_ = fStack_1b4;
    auVar55._0_4_ = local_1b8;
    auVar55._8_4_ = fStack_1b0;
    auVar55._12_4_ = fStack_1ac;
    auVar55._16_4_ = fStack_1a8;
    auVar55._20_4_ = fStack_1a4;
    auVar55._24_4_ = fStack_1a0;
    auVar55._28_4_ = fStack_19c;
    auVar19 = vcmpps_avx(auVar19,auVar55,5);
    auVar87 = vandps_avx(auVar19,auVar87);
    auVar19 = local_288 & auVar87;
    uVar59 = 0;
    if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar19 >> 0x7f,0) != '\0') ||
          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar19 >> 0xbf,0) != '\0') ||
        (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar19[0x1f] < '\0')
    {
      auVar19 = vsubps_avx(auVar23,local_98);
      auVar20 = vsubps_avx(auVar25,auVar300);
      fVar143 = auVar19._0_4_ + auVar20._0_4_;
      fVar175 = auVar19._4_4_ + auVar20._4_4_;
      fVar176 = auVar19._8_4_ + auVar20._8_4_;
      fVar200 = auVar19._12_4_ + auVar20._12_4_;
      fVar201 = auVar19._16_4_ + auVar20._16_4_;
      fVar202 = auVar19._20_4_ + auVar20._20_4_;
      fVar203 = auVar19._24_4_ + auVar20._24_4_;
      auVar21 = vsubps_avx(auVar24,local_b8);
      auVar22 = vsubps_avx(local_78,ZEXT1632(auVar72));
      auVar109._0_4_ = auVar21._0_4_ + auVar22._0_4_;
      auVar109._4_4_ = auVar21._4_4_ + auVar22._4_4_;
      auVar109._8_4_ = auVar21._8_4_ + auVar22._8_4_;
      auVar109._12_4_ = auVar21._12_4_ + auVar22._12_4_;
      auVar109._16_4_ = auVar21._16_4_ + auVar22._16_4_;
      auVar109._20_4_ = auVar21._20_4_ + auVar22._20_4_;
      auVar109._24_4_ = auVar21._24_4_ + auVar22._24_4_;
      fVar142 = auVar22._28_4_;
      auVar109._28_4_ = auVar21._28_4_ + fVar142;
      auVar325._0_4_ = fVar111 * fVar143;
      auVar325._4_4_ = fVar125 * fVar175;
      auVar325._8_4_ = fVar126 * fVar176;
      auVar325._12_4_ = fVar127 * fVar200;
      auVar325._16_4_ = fVar201 * 0.0;
      auVar325._20_4_ = fVar202 * 0.0;
      auVar325._24_4_ = fVar203 * 0.0;
      auVar325._28_4_ = 0;
      auVar71 = vfnmadd231ps_fma(auVar325,auVar109,local_98);
      auVar43._4_4_ = fVar175 * fStack_154;
      auVar43._0_4_ = fVar143 * local_158;
      auVar43._8_4_ = fVar176 * fStack_150;
      auVar43._12_4_ = fVar200 * fStack_14c;
      auVar43._16_4_ = fVar201 * fStack_148;
      auVar43._20_4_ = fVar202 * fStack_144;
      auVar43._24_4_ = fVar203 * fStack_140;
      auVar43._28_4_ = fVar142;
      auVar52._4_4_ = fVar271;
      auVar52._0_4_ = fVar256;
      auVar52._8_4_ = fVar272;
      auVar52._12_4_ = fVar273;
      auVar52._16_4_ = fVar274;
      auVar52._20_4_ = fVar275;
      auVar52._24_4_ = fVar276;
      auVar52._28_4_ = 0x40400000;
      auVar13 = vfnmadd213ps_fma(auVar52,auVar109,auVar43);
      auVar44._4_4_ = fVar175 * local_178._4_4_;
      auVar44._0_4_ = fVar143 * local_178._0_4_;
      auVar44._8_4_ = fVar176 * local_178._8_4_;
      auVar44._12_4_ = fVar200 * local_178._12_4_;
      auVar44._16_4_ = fVar201 * local_178._16_4_;
      auVar44._20_4_ = fVar202 * local_178._20_4_;
      auVar44._24_4_ = fVar203 * local_178._24_4_;
      auVar44._28_4_ = fVar142;
      auVar85 = vfnmadd213ps_fma(local_d8,auVar109,auVar44);
      auVar45._4_4_ = (float)local_5e8._4_4_ * fVar175;
      auVar45._0_4_ = (float)local_5e8._0_4_ * fVar143;
      auVar45._8_4_ = (float)uStack_5e0 * fVar176;
      auVar45._12_4_ = uStack_5e0._4_4_ * fVar200;
      auVar45._16_4_ = (float)uStack_5d8 * fVar201;
      auVar45._20_4_ = uStack_5d8._4_4_ * fVar202;
      auVar45._24_4_ = (float)uStack_5d0 * fVar203;
      auVar45._28_4_ = fVar142;
      auVar72 = vfnmadd231ps_fma(auVar45,auVar109,auVar23);
      auVar123._0_4_ = fVar160 * fVar143;
      auVar123._4_4_ = fVar172 * fVar175;
      auVar123._8_4_ = fVar173 * fVar176;
      auVar123._12_4_ = fVar174 * fVar200;
      auVar123._16_4_ = fVar201 * 0.0;
      auVar123._20_4_ = fVar202 * 0.0;
      auVar123._24_4_ = fVar203 * 0.0;
      auVar123._28_4_ = 0;
      auVar88 = vfnmadd231ps_fma(auVar123,auVar109,auVar300);
      auVar46._4_4_ = fVar175 * local_138._4_4_;
      auVar46._0_4_ = fVar143 * local_138._0_4_;
      auVar46._8_4_ = fVar176 * local_138._8_4_;
      auVar46._12_4_ = fVar200 * local_138._12_4_;
      auVar46._16_4_ = fVar201 * local_138._16_4_;
      auVar46._20_4_ = fVar202 * local_138._20_4_;
      auVar46._24_4_ = fVar203 * local_138._24_4_;
      auVar46._28_4_ = auVar24._28_4_;
      auVar321 = vfnmadd213ps_fma(local_f8,auVar109,auVar46);
      auVar47._4_4_ = fVar175 * local_118._4_4_;
      auVar47._0_4_ = fVar143 * local_118._0_4_;
      auVar47._8_4_ = fVar176 * local_118._8_4_;
      auVar47._12_4_ = fVar200 * local_118._12_4_;
      auVar47._16_4_ = fVar201 * local_118._16_4_;
      auVar47._20_4_ = fVar202 * local_118._20_4_;
      auVar47._24_4_ = fVar203 * local_118._24_4_;
      auVar47._28_4_ = auVar24._28_4_;
      auVar74 = vfnmadd213ps_fma(auVar26,auVar109,auVar47);
      auVar48._4_4_ = local_78._4_4_ * fVar175;
      auVar48._0_4_ = local_78._0_4_ * fVar143;
      auVar48._8_4_ = local_78._8_4_ * fVar176;
      auVar48._12_4_ = local_78._12_4_ * fVar200;
      auVar48._16_4_ = local_78._16_4_ * fVar201;
      auVar48._20_4_ = local_78._20_4_ * fVar202;
      auVar48._24_4_ = local_78._24_4_ * fVar203;
      auVar48._28_4_ = auVar19._28_4_ + auVar20._28_4_;
      auVar233 = vfnmadd231ps_fma(auVar48,auVar109,auVar25);
      auVar20 = vminps_avx(ZEXT1632(auVar71),ZEXT1632(auVar13));
      auVar19 = vmaxps_avx(ZEXT1632(auVar71),ZEXT1632(auVar13));
      auVar21 = vminps_avx(ZEXT1632(auVar85),ZEXT1632(auVar72));
      auVar21 = vminps_avx(auVar20,auVar21);
      auVar20 = vmaxps_avx(ZEXT1632(auVar85),ZEXT1632(auVar72));
      auVar19 = vmaxps_avx(auVar19,auVar20);
      auVar22 = vminps_avx(ZEXT1632(auVar88),ZEXT1632(auVar321));
      auVar20 = vmaxps_avx(ZEXT1632(auVar88),ZEXT1632(auVar321));
      auVar23 = vminps_avx(ZEXT1632(auVar74),ZEXT1632(auVar233));
      auVar22 = vminps_avx(auVar22,auVar23);
      auVar22 = vminps_avx(auVar21,auVar22);
      auVar21 = vmaxps_avx(ZEXT1632(auVar74),ZEXT1632(auVar233));
      auVar20 = vmaxps_avx(auVar20,auVar21);
      auVar20 = vmaxps_avx(auVar19,auVar20);
      auVar19 = vcmpps_avx(auVar22,auVar56,2);
      auVar20 = vcmpps_avx(auVar20,auVar55,5);
      auVar19 = vandps_avx(auVar20,auVar19);
      auVar87 = vandps_avx(auVar87,local_288);
      auVar20 = auVar87 & auVar19;
      if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar20 >> 0x7f,0) != '\0') ||
            (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar20 >> 0xbf,0) != '\0') ||
          (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar20[0x1f] < '\0') {
        auVar87 = vandps_avx(auVar19,auVar87);
        uVar59 = vmovmskps_avx(auVar87);
      }
    }
    if (uVar59 != 0) {
      auStack_3b8[uVar62] = uVar59;
      uVar177 = vmovlps_avx(local_338);
      *(undefined8 *)(&uStack_268 + uVar62 * 2) = uVar177;
      uVar67 = vmovlps_avx(local_668);
      auStack_58[uVar62] = uVar67;
      uVar62 = (ulong)((int)uVar62 + 1);
    }
    do {
      if ((int)uVar62 == 0) {
        uVar70 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar86._4_4_ = uVar70;
        auVar86._0_4_ = uVar70;
        auVar86._8_4_ = uVar70;
        auVar86._12_4_ = uVar70;
        auVar13 = vcmpps_avx(local_388,auVar86,2);
        uVar61 = vmovmskps_avx(auVar13);
        uVar58 = uVar58 & uVar58 + 0xf & uVar61;
        if (uVar58 == 0) {
          return;
        }
        goto LAB_0175f43e;
      }
      uVar60 = (int)uVar62 - 1;
      uVar63 = (ulong)uVar60;
      uVar66 = auStack_3b8[uVar63];
      uVar59 = (&uStack_268)[uVar63 * 2];
      fVar160 = afStack_264[uVar63 * 2];
      iVar27 = 0;
      for (uVar67 = (ulong)uVar66; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
        iVar27 = iVar27 + 1;
      }
      uVar66 = uVar66 - 1 & uVar66;
      if (uVar66 == 0) {
        uVar62 = (ulong)uVar60;
      }
      local_668._8_8_ = 0;
      local_668._0_8_ = auStack_58[uVar63];
      auStack_3b8[uVar63] = uVar66;
      fVar172 = (float)(iVar27 + 1) * 0.14285715;
      auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar160 * (float)iVar27 * 0.14285715)),
                                ZEXT416(uVar59),ZEXT416((uint)(1.0 - (float)iVar27 * 0.14285715)));
      auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar160 * fVar172)),ZEXT416(uVar59),
                                ZEXT416((uint)(1.0 - fVar172)));
      auVar199._0_4_ = auVar13._0_4_;
      fVar172 = auVar85._0_4_;
      fVar160 = fVar172 - auVar199._0_4_;
      if (0.16666667 <= fVar160) break;
      auVar321 = vshufps_avx(local_668,local_668,0x50);
      auVar116._8_4_ = 0x3f800000;
      auVar116._0_8_ = &DAT_3f8000003f800000;
      auVar116._12_4_ = 0x3f800000;
      auVar74 = vsubps_avx(auVar116,auVar321);
      fVar173 = auVar321._0_4_;
      auVar133._0_4_ = fVar173 * fVar128;
      fVar174 = auVar321._4_4_;
      auVar133._4_4_ = fVar174 * fVar141;
      fVar111 = auVar321._8_4_;
      auVar133._8_4_ = fVar111 * fVar128;
      fVar125 = auVar321._12_4_;
      auVar133._12_4_ = fVar125 * fVar141;
      auVar148._0_4_ = fVar173 * fVar206;
      auVar148._4_4_ = fVar174 * fVar224;
      auVar148._8_4_ = fVar111 * fVar206;
      auVar148._12_4_ = fVar125 * fVar224;
      auVar166._0_4_ = fVar173 * fVar242;
      auVar166._4_4_ = fVar174 * fVar255;
      auVar166._8_4_ = fVar111 * fVar242;
      auVar166._12_4_ = fVar125 * fVar255;
      auVar100._0_4_ = fVar173 * fVar315;
      auVar100._4_4_ = fVar174 * fVar326;
      auVar100._8_4_ = fVar111 * fVar315;
      auVar100._12_4_ = fVar125 * fVar326;
      auVar321 = vfmadd231ps_fma(auVar133,auVar74,auVar193);
      auVar71 = vfmadd231ps_fma(auVar148,auVar74,auVar230);
      auVar72 = vfmadd231ps_fma(auVar166,auVar74,auVar262);
      auVar74 = vfmadd231ps_fma(auVar100,auVar74,auVar304);
      auVar124._16_16_ = auVar321;
      auVar124._0_16_ = auVar321;
      auVar139._16_16_ = auVar71;
      auVar139._0_16_ = auVar71;
      auVar159._16_16_ = auVar72;
      auVar159._0_16_ = auVar72;
      auVar199._4_4_ = auVar199._0_4_;
      auVar199._8_4_ = auVar199._0_4_;
      auVar199._12_4_ = auVar199._0_4_;
      auVar199._20_4_ = fVar172;
      auVar199._16_4_ = fVar172;
      auVar199._24_4_ = fVar172;
      auVar199._28_4_ = fVar172;
      auVar87 = vsubps_avx(auVar139,auVar124);
      auVar71 = vfmadd213ps_fma(auVar87,auVar199,auVar124);
      auVar87 = vsubps_avx(auVar159,auVar139);
      auVar88 = vfmadd213ps_fma(auVar87,auVar199,auVar139);
      auVar321 = vsubps_avx(auVar74,auVar72);
      auVar140._16_16_ = auVar321;
      auVar140._0_16_ = auVar321;
      auVar321 = vfmadd213ps_fma(auVar140,auVar199,auVar159);
      auVar87 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar71));
      auVar74 = vfmadd213ps_fma(auVar87,auVar199,ZEXT1632(auVar71));
      auVar87 = vsubps_avx(ZEXT1632(auVar321),ZEXT1632(auVar88));
      auVar321 = vfmadd213ps_fma(auVar87,auVar199,ZEXT1632(auVar88));
      auVar87 = vsubps_avx(ZEXT1632(auVar321),ZEXT1632(auVar74));
      auVar113 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar87,auVar199);
      fVar127 = auVar87._4_4_ * 3.0;
      fVar126 = fVar160 * 0.33333334;
      auVar263._0_8_ =
           CONCAT44(auVar113._4_4_ + fVar126 * fVar127,
                    auVar113._0_4_ + fVar126 * auVar87._0_4_ * 3.0);
      auVar263._8_4_ = auVar113._8_4_ + fVar126 * auVar87._8_4_ * 3.0;
      auVar263._12_4_ = auVar113._12_4_ + fVar126 * auVar87._12_4_ * 3.0;
      auVar74 = vshufpd_avx(auVar113,auVar113,3);
      auVar71 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar321 = vsubps_avx(auVar74,auVar113);
      auVar72 = vsubps_avx(auVar71,(undefined1  [16])0x0);
      auVar117._0_4_ = auVar321._0_4_ + auVar72._0_4_;
      auVar117._4_4_ = auVar321._4_4_ + auVar72._4_4_;
      auVar117._8_4_ = auVar321._8_4_ + auVar72._8_4_;
      auVar117._12_4_ = auVar321._12_4_ + auVar72._12_4_;
      auVar321 = vshufps_avx(auVar113,auVar113,0xb1);
      auVar72 = vshufps_avx(auVar263,auVar263,0xb1);
      auVar305._4_4_ = auVar117._0_4_;
      auVar305._0_4_ = auVar117._0_4_;
      auVar305._8_4_ = auVar117._0_4_;
      auVar305._12_4_ = auVar117._0_4_;
      auVar88 = vshufps_avx(auVar117,auVar117,0x55);
      fVar173 = auVar88._0_4_;
      auVar214._0_4_ = auVar321._0_4_ * fVar173;
      fVar174 = auVar88._4_4_;
      auVar214._4_4_ = auVar321._4_4_ * fVar174;
      fVar111 = auVar88._8_4_;
      auVar214._8_4_ = auVar321._8_4_ * fVar111;
      fVar125 = auVar88._12_4_;
      auVar214._12_4_ = auVar321._12_4_ * fVar125;
      auVar231._0_4_ = auVar72._0_4_ * fVar173;
      auVar231._4_4_ = auVar72._4_4_ * fVar174;
      auVar231._8_4_ = auVar72._8_4_ * fVar111;
      auVar231._12_4_ = auVar72._12_4_ * fVar125;
      auVar233 = vfmadd231ps_fma(auVar214,auVar305,auVar113);
      auVar112 = vfmadd231ps_fma(auVar231,auVar305,auVar263);
      auVar72 = vshufps_avx(auVar233,auVar233,0xe8);
      auVar88 = vshufps_avx(auVar112,auVar112,0xe8);
      auVar321 = vcmpps_avx(auVar72,auVar88,1);
      uVar59 = vextractps_avx(auVar321,0);
      auVar114 = auVar112;
      if ((uVar59 & 1) == 0) {
        auVar114 = auVar233;
      }
      auVar149._0_4_ = fVar126 * auVar87._16_4_ * 3.0;
      auVar149._4_4_ = fVar126 * fVar127;
      auVar149._8_4_ = fVar126 * auVar87._24_4_ * 3.0;
      auVar149._12_4_ = fVar126 * fVar172;
      auVar179 = vsubps_avx((undefined1  [16])0x0,auVar149);
      auVar150 = vshufps_avx(auVar179,auVar179,0xb1);
      auVar161 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar329._0_4_ = auVar150._0_4_ * fVar173;
      auVar329._4_4_ = auVar150._4_4_ * fVar174;
      auVar329._8_4_ = auVar150._8_4_ * fVar111;
      auVar329._12_4_ = auVar150._12_4_ * fVar125;
      auVar118._0_4_ = auVar161._0_4_ * fVar173;
      auVar118._4_4_ = auVar161._4_4_ * fVar174;
      auVar118._8_4_ = auVar161._8_4_ * fVar111;
      auVar118._12_4_ = auVar161._12_4_ * fVar125;
      auVar207 = vfmadd231ps_fma(auVar329,auVar305,auVar179);
      auVar208 = vfmadd231ps_fma(auVar118,(undefined1  [16])0x0,auVar305);
      auVar161 = vshufps_avx(auVar207,auVar207,0xe8);
      auVar178 = vshufps_avx(auVar208,auVar208,0xe8);
      auVar150 = vcmpps_avx(auVar161,auVar178,1);
      uVar59 = vextractps_avx(auVar150,0);
      auVar225 = auVar208;
      if ((uVar59 & 1) == 0) {
        auVar225 = auVar207;
      }
      auVar114 = vmaxss_avx(auVar225,auVar114);
      auVar72 = vminps_avx(auVar72,auVar88);
      auVar88 = vminps_avx(auVar161,auVar178);
      auVar88 = vminps_avx(auVar72,auVar88);
      auVar321 = vshufps_avx(auVar321,auVar321,0x55);
      auVar321 = vblendps_avx(auVar321,auVar150,2);
      auVar150 = vpslld_avx(auVar321,0x1f);
      auVar321 = vshufpd_avx(auVar112,auVar112,1);
      auVar321 = vinsertps_avx(auVar321,auVar208,0x9c);
      auVar72 = vshufpd_avx(auVar233,auVar233,1);
      auVar72 = vinsertps_avx(auVar72,auVar207,0x9c);
      auVar321 = vblendvps_avx(auVar72,auVar321,auVar150);
      auVar72 = vmovshdup_avx(auVar321);
      auVar321 = vmaxss_avx(auVar72,auVar321);
      fVar111 = auVar88._0_4_;
      auVar72 = vmovshdup_avx(auVar88);
      fVar174 = auVar321._0_4_;
      fVar173 = auVar114._0_4_;
      if ((0.0001 <= fVar111) || (fVar174 <= -0.0001)) {
        auVar233 = vcmpps_avx(auVar72,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar112 = vcmpps_avx(auVar88,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar233 = vorps_avx(auVar112,auVar233);
        if ((-0.0001 < fVar173 & auVar233[0]) != 0) goto LAB_01760942;
        auVar233 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar321,5);
        auVar112 = vcmpps_avx(auVar72,SUB6416(ZEXT464(0x38d1b717),0),5);
        auVar233 = vorps_avx(auVar112,auVar233);
        if ((auVar233 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_01760942;
LAB_017612e4:
        bVar49 = true;
      }
      else {
LAB_01760942:
        auVar112 = vcmpps_avx(auVar88,_DAT_01feba10,1);
        auVar150 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar233 = vcmpss_avx(auVar114,ZEXT816(0) << 0x20,1);
        auVar167._8_4_ = 0x3f800000;
        auVar167._0_8_ = &DAT_3f8000003f800000;
        auVar167._12_4_ = 0x3f800000;
        auVar232._8_4_ = 0xbf800000;
        auVar232._0_8_ = 0xbf800000bf800000;
        auVar232._12_4_ = 0xbf800000;
        auVar233 = vblendvps_avx(auVar167,auVar232,auVar233);
        auVar112 = vblendvps_avx(auVar167,auVar232,auVar112);
        fVar125 = auVar112._0_4_;
        fVar126 = auVar233._0_4_;
        auVar233 = SUB6416(ZEXT864(0),0) << 0x20;
        if ((fVar125 == fVar126) && (!NAN(fVar125) && !NAN(fVar126))) {
          auVar233 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar161 = ZEXT816(0) << 0x20;
        if ((fVar125 == fVar126) && (!NAN(fVar125) && !NAN(fVar126))) {
          auVar150 = SUB6416(ZEXT464(0xff800000),0);
        }
        auVar112 = vmovshdup_avx(auVar112);
        fVar127 = auVar112._0_4_;
        if ((fVar125 != fVar127) || (NAN(fVar125) || NAN(fVar127))) {
          fVar125 = auVar72._0_4_;
          if ((fVar125 != fVar111) || (NAN(fVar125) || NAN(fVar111))) {
            auVar119._0_8_ = auVar88._0_8_ ^ 0x8000000080000000;
            auVar119._8_4_ = auVar88._8_4_ ^ 0x80000000;
            auVar119._12_4_ = auVar88._12_4_ ^ 0x80000000;
            auVar151._0_4_ = -fVar111 / (fVar125 - fVar111);
            auVar151._4_12_ = auVar119._4_12_;
            auVar72 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar151._0_4_)),auVar161,auVar151);
            auVar88 = auVar72;
          }
          else {
            auVar72 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar111 == 0.0) && (auVar72 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar111))) {
              auVar72 = ZEXT816(0);
            }
            auVar88 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar111 == 0.0) && (auVar88 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar111))) {
              auVar88 = SUB6416(ZEXT464(0x3f800000),0);
            }
          }
          auVar233 = vminss_avx(auVar233,auVar72);
          auVar150 = vmaxss_avx(auVar88,auVar150);
        }
        auVar321 = vcmpss_avx(auVar321,auVar161,1);
        auVar152._8_4_ = 0x3f800000;
        auVar152._0_8_ = &DAT_3f8000003f800000;
        auVar152._12_4_ = 0x3f800000;
        auVar292._8_4_ = 0xbf800000;
        auVar292._0_8_ = 0xbf800000bf800000;
        auVar292._12_4_ = 0xbf800000;
        auVar321 = vblendvps_avx(auVar152,auVar292,auVar321);
        fVar111 = auVar321._0_4_;
        auVar321 = SUB6416(ZEXT464(0x3f800000),0);
        if ((fVar126 != fVar111) || (NAN(fVar126) || NAN(fVar111))) {
          if ((fVar174 != fVar173) || (NAN(fVar174) || NAN(fVar173))) {
            auVar120._0_8_ = auVar114._0_8_ ^ 0x8000000080000000;
            auVar120._8_4_ = auVar114._8_4_ ^ 0x80000000;
            auVar120._12_4_ = auVar114._12_4_ ^ 0x80000000;
            auVar153._0_4_ = -fVar173 / (fVar174 - fVar173);
            auVar153._4_12_ = auVar120._4_12_;
            auVar72 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar153._0_4_)),auVar161,auVar153);
            auVar88 = auVar72;
          }
          else {
            auVar72 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar173 == 0.0) && (auVar72 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar173))) {
              auVar72 = ZEXT816(0);
            }
            auVar88 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar173 == 0.0) && (auVar88 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar173))) {
              auVar88 = auVar321;
            }
          }
          auVar233 = vminss_avx(auVar233,auVar72);
          auVar150 = vmaxss_avx(auVar88,auVar150);
        }
        if ((fVar127 != fVar111) || (NAN(fVar127) || NAN(fVar111))) {
          auVar233 = vminss_avx(auVar233,auVar321);
          auVar150 = vmaxss_avx(auVar321,auVar150);
        }
        auVar72 = vmaxss_avx(auVar161,auVar233);
        auVar88 = vminss_avx(auVar150,auVar321);
        bVar49 = true;
        if (auVar72._0_4_ <= auVar88._0_4_) {
          auVar72 = vmaxss_avx(auVar161,ZEXT416((uint)(auVar72._0_4_ + -0.1)));
          auVar321 = vminss_avx(ZEXT416((uint)(auVar88._0_4_ + 0.1)),auVar321);
          auVar101._0_8_ = auVar113._0_8_;
          auVar101._8_8_ = auVar101._0_8_;
          auVar234._8_8_ = auVar263._0_8_;
          auVar234._0_8_ = auVar263._0_8_;
          auVar250._8_8_ = auVar179._0_8_;
          auVar250._0_8_ = auVar179._0_8_;
          auVar88 = vshufpd_avx(auVar263,auVar263,3);
          auVar233 = vshufpd_avx(auVar179,auVar179,3);
          auVar112 = vshufps_avx(auVar72,auVar321,0);
          auVar134._8_4_ = 0x3f800000;
          auVar134._0_8_ = &DAT_3f8000003f800000;
          auVar134._12_4_ = 0x3f800000;
          auVar113 = vsubps_avx(auVar134,auVar112);
          local_608._0_4_ = auVar74._0_4_;
          local_608._4_4_ = auVar74._4_4_;
          fStack_600 = auVar74._8_4_;
          fStack_5fc = auVar74._12_4_;
          fVar173 = auVar112._0_4_;
          auVar135._0_4_ = fVar173 * (float)local_608._0_4_;
          fVar174 = auVar112._4_4_;
          auVar135._4_4_ = fVar174 * (float)local_608._4_4_;
          fVar111 = auVar112._8_4_;
          auVar135._8_4_ = fVar111 * fStack_600;
          fVar125 = auVar112._12_4_;
          auVar135._12_4_ = fVar125 * fStack_5fc;
          auVar154._0_4_ = auVar88._0_4_ * fVar173;
          auVar154._4_4_ = auVar88._4_4_ * fVar174;
          auVar154._8_4_ = auVar88._8_4_ * fVar111;
          auVar154._12_4_ = auVar88._12_4_ * fVar125;
          auVar168._0_4_ = auVar233._0_4_ * fVar173;
          auVar168._4_4_ = auVar233._4_4_ * fVar174;
          auVar168._8_4_ = auVar233._8_4_ * fVar111;
          auVar168._12_4_ = auVar233._12_4_ * fVar125;
          local_5e8._0_4_ = auVar71._0_4_;
          local_5e8._4_4_ = auVar71._4_4_;
          uStack_5e0._0_4_ = auVar71._8_4_;
          uStack_5e0._4_4_ = auVar71._12_4_;
          auVar194._0_4_ = fVar173 * (float)local_5e8._0_4_;
          auVar194._4_4_ = fVar174 * (float)local_5e8._4_4_;
          auVar194._8_4_ = fVar111 * (float)uStack_5e0;
          auVar194._12_4_ = fVar125 * uStack_5e0._4_4_;
          auVar88 = vfmadd231ps_fma(auVar135,auVar113,auVar101);
          auVar233 = vfmadd231ps_fma(auVar154,auVar113,auVar234);
          auVar112 = vfmadd231ps_fma(auVar168,auVar113,auVar250);
          auVar113 = vfmadd231ps_fma(auVar194,auVar113,ZEXT816(0));
          auVar74 = vmovshdup_avx(local_668);
          auVar161 = vfmadd231ss_fma(ZEXT416((uint)(auVar74._0_4_ * auVar72._0_4_)),local_668,
                                     ZEXT416((uint)(1.0 - auVar72._0_4_)));
          auVar178 = vfmadd231ss_fma(ZEXT416((uint)(auVar74._0_4_ * auVar321._0_4_)),local_668,
                                     ZEXT416((uint)(1.0 - auVar321._0_4_)));
          fVar173 = 1.0 / fVar160;
          auVar321 = vsubps_avx(auVar233,auVar88);
          auVar215._0_4_ = auVar321._0_4_ * 3.0;
          auVar215._4_4_ = auVar321._4_4_ * 3.0;
          auVar215._8_4_ = auVar321._8_4_ * 3.0;
          auVar215._12_4_ = auVar321._12_4_ * 3.0;
          auVar321 = vsubps_avx(auVar112,auVar233);
          auVar235._0_4_ = auVar321._0_4_ * 3.0;
          auVar235._4_4_ = auVar321._4_4_ * 3.0;
          auVar235._8_4_ = auVar321._8_4_ * 3.0;
          auVar235._12_4_ = auVar321._12_4_ * 3.0;
          auVar321 = vsubps_avx(auVar113,auVar112);
          auVar251._0_4_ = auVar321._0_4_ * 3.0;
          auVar251._4_4_ = auVar321._4_4_ * 3.0;
          auVar251._8_4_ = auVar321._8_4_ * 3.0;
          auVar251._12_4_ = auVar321._12_4_ * 3.0;
          auVar74 = vminps_avx(auVar235,auVar251);
          auVar321 = vmaxps_avx(auVar235,auVar251);
          auVar74 = vminps_avx(auVar215,auVar74);
          auVar321 = vmaxps_avx(auVar215,auVar321);
          auVar71 = vshufpd_avx(auVar74,auVar74,3);
          auVar72 = vshufpd_avx(auVar321,auVar321,3);
          auVar74 = vminps_avx(auVar74,auVar71);
          auVar321 = vmaxps_avx(auVar321,auVar72);
          auVar236._0_4_ = auVar74._0_4_ * fVar173;
          auVar236._4_4_ = auVar74._4_4_ * fVar173;
          auVar236._8_4_ = auVar74._8_4_ * fVar173;
          auVar236._12_4_ = auVar74._12_4_ * fVar173;
          auVar216._0_4_ = fVar173 * auVar321._0_4_;
          auVar216._4_4_ = fVar173 * auVar321._4_4_;
          auVar216._8_4_ = fVar173 * auVar321._8_4_;
          auVar216._12_4_ = fVar173 * auVar321._12_4_;
          fVar173 = 1.0 / (auVar178._0_4_ - auVar161._0_4_);
          auVar321 = vshufpd_avx(auVar88,auVar88,3);
          auVar74 = vshufpd_avx(auVar233,auVar233,3);
          auVar71 = vshufpd_avx(auVar112,auVar112,3);
          auVar72 = vshufpd_avx(auVar113,auVar113,3);
          auVar321 = vsubps_avx(auVar321,auVar88);
          auVar88 = vsubps_avx(auVar74,auVar233);
          auVar233 = vsubps_avx(auVar71,auVar112);
          auVar72 = vsubps_avx(auVar72,auVar113);
          auVar74 = vminps_avx(auVar321,auVar88);
          auVar321 = vmaxps_avx(auVar321,auVar88);
          auVar71 = vminps_avx(auVar233,auVar72);
          auVar71 = vminps_avx(auVar74,auVar71);
          auVar74 = vmaxps_avx(auVar233,auVar72);
          auVar321 = vmaxps_avx(auVar321,auVar74);
          auVar281._0_4_ = fVar173 * auVar71._0_4_;
          auVar281._4_4_ = fVar173 * auVar71._4_4_;
          auVar281._8_4_ = fVar173 * auVar71._8_4_;
          auVar281._12_4_ = fVar173 * auVar71._12_4_;
          auVar264._0_4_ = fVar173 * auVar321._0_4_;
          auVar264._4_4_ = fVar173 * auVar321._4_4_;
          auVar264._8_4_ = fVar173 * auVar321._8_4_;
          auVar264._12_4_ = fVar173 * auVar321._12_4_;
          auVar72 = vinsertps_avx(auVar13,auVar161,0x10);
          auVar88 = vinsertps_avx(auVar85,auVar178,0x10);
          auVar84._0_4_ = (auVar72._0_4_ + auVar88._0_4_) * 0.5;
          auVar84._4_4_ = (auVar72._4_4_ + auVar88._4_4_) * 0.5;
          auVar84._8_4_ = (auVar72._8_4_ + auVar88._8_4_) * 0.5;
          auVar84._12_4_ = (auVar72._12_4_ + auVar88._12_4_) * 0.5;
          auVar136._4_4_ = auVar84._0_4_;
          auVar136._0_4_ = auVar84._0_4_;
          auVar136._8_4_ = auVar84._0_4_;
          auVar136._12_4_ = auVar84._0_4_;
          auVar321 = vfmadd213ps_fma(local_298,auVar136,auVar14);
          auVar74 = vfmadd213ps_fma(local_2a8,auVar136,auVar15);
          auVar71 = vfmadd213ps_fma(local_2b8,auVar136,auVar182);
          auVar85 = vsubps_avx(auVar74,auVar321);
          auVar321 = vfmadd213ps_fma(auVar85,auVar136,auVar321);
          auVar85 = vsubps_avx(auVar71,auVar74);
          auVar85 = vfmadd213ps_fma(auVar85,auVar136,auVar74);
          auVar85 = vsubps_avx(auVar85,auVar321);
          auVar321 = vfmadd231ps_fma(auVar321,auVar85,auVar136);
          auVar137._0_8_ = CONCAT44(auVar85._4_4_ * 3.0,auVar85._0_4_ * 3.0);
          auVar137._8_4_ = auVar85._8_4_ * 3.0;
          auVar137._12_4_ = auVar85._12_4_ * 3.0;
          auVar252._8_8_ = auVar321._0_8_;
          auVar252._0_8_ = auVar321._0_8_;
          auVar85 = vshufpd_avx(auVar321,auVar321,3);
          auVar321 = vshufps_avx(auVar84,auVar84,0x55);
          auVar233 = vsubps_avx(auVar85,auVar252);
          auVar113 = vfmadd231ps_fma(auVar252,auVar321,auVar233);
          auVar306._8_8_ = auVar137._0_8_;
          auVar306._0_8_ = auVar137._0_8_;
          auVar85 = vshufpd_avx(auVar137,auVar137,3);
          auVar85 = vsubps_avx(auVar85,auVar306);
          auVar112 = vfmadd213ps_fma(auVar85,auVar321,auVar306);
          auVar321 = vmovshdup_avx(auVar112);
          auVar307._0_8_ = auVar321._0_8_ ^ 0x8000000080000000;
          auVar307._8_4_ = auVar321._8_4_ ^ 0x80000000;
          auVar307._12_4_ = auVar321._12_4_ ^ 0x80000000;
          auVar74 = vmovshdup_avx(auVar233);
          auVar85 = vunpcklps_avx(auVar74,auVar307);
          auVar71 = vshufps_avx(auVar85,auVar307,4);
          auVar330._0_8_ = auVar233._0_8_ ^ 0x8000000080000000;
          auVar330._8_4_ = auVar233._8_4_ ^ 0x80000000;
          auVar330._12_4_ = auVar233._12_4_ ^ 0x80000000;
          auVar85 = vmovlhps_avx(auVar330,auVar112);
          auVar85 = vshufps_avx(auVar85,auVar112,8);
          auVar321 = vfmsub231ss_fma(ZEXT416((uint)(auVar321._0_4_ * auVar233._0_4_)),auVar74,
                                     auVar112);
          auVar155._0_4_ = auVar321._0_4_;
          auVar155._4_4_ = auVar155._0_4_;
          auVar155._8_4_ = auVar155._0_4_;
          auVar155._12_4_ = auVar155._0_4_;
          auVar321 = vdivps_avx(auVar71,auVar155);
          auVar74 = vdivps_avx(auVar85,auVar155);
          fVar111 = auVar113._0_4_;
          fVar173 = auVar321._0_4_;
          auVar85 = vshufps_avx(auVar113,auVar113,0x55);
          fVar174 = auVar74._0_4_;
          local_5e8._4_4_ = fVar111 * auVar321._4_4_ + auVar85._4_4_ * auVar74._4_4_;
          local_5e8._0_4_ = fVar111 * fVar173 + auVar85._0_4_ * fVar174;
          uStack_5e0._0_4_ = fVar111 * auVar321._8_4_ + auVar85._8_4_ * auVar74._8_4_;
          uStack_5e0._4_4_ = fVar111 * auVar321._12_4_ + auVar85._12_4_ * auVar74._12_4_;
          auVar233 = vmovshdup_avx(auVar321);
          auVar85 = vinsertps_avx(auVar236,auVar281,0x1c);
          auVar322._0_4_ = auVar233._0_4_ * auVar85._0_4_;
          auVar322._4_4_ = auVar233._4_4_ * auVar85._4_4_;
          auVar322._8_4_ = auVar233._8_4_ * auVar85._8_4_;
          auVar322._12_4_ = auVar233._12_4_ * auVar85._12_4_;
          auVar71 = vinsertps_avx(auVar216,auVar264,0x1c);
          auVar293._0_4_ = auVar233._0_4_ * auVar71._0_4_;
          auVar293._4_4_ = auVar233._4_4_ * auVar71._4_4_;
          auVar293._8_4_ = auVar233._8_4_ * auVar71._8_4_;
          auVar293._12_4_ = auVar233._12_4_ * auVar71._12_4_;
          auVar114 = vminps_avx(auVar322,auVar293);
          auVar113 = vmaxps_avx(auVar293,auVar322);
          auVar233 = vinsertps_avx(auVar281,auVar236,0x4c);
          auVar150 = vmovshdup_avx(auVar74);
          auVar112 = vinsertps_avx(auVar264,auVar216,0x4c);
          auVar265._0_4_ = auVar150._0_4_ * auVar233._0_4_;
          auVar265._4_4_ = auVar150._4_4_ * auVar233._4_4_;
          auVar265._8_4_ = auVar150._8_4_ * auVar233._8_4_;
          auVar265._12_4_ = auVar150._12_4_ * auVar233._12_4_;
          auVar282._0_4_ = auVar150._0_4_ * auVar112._0_4_;
          auVar282._4_4_ = auVar150._4_4_ * auVar112._4_4_;
          auVar282._8_4_ = auVar150._8_4_ * auVar112._8_4_;
          auVar282._12_4_ = auVar150._12_4_ * auVar112._12_4_;
          auVar150 = vminps_avx(auVar265,auVar282);
          auVar102._0_4_ = auVar150._0_4_ + auVar114._0_4_;
          auVar102._4_4_ = auVar150._4_4_ + auVar114._4_4_;
          auVar102._8_4_ = auVar150._8_4_ + auVar114._8_4_;
          auVar102._12_4_ = auVar150._12_4_ + auVar114._12_4_;
          auVar114 = vmaxps_avx(auVar282,auVar265);
          auVar266._0_4_ = auVar113._0_4_ + auVar114._0_4_;
          auVar266._4_4_ = auVar113._4_4_ + auVar114._4_4_;
          auVar266._8_4_ = auVar113._8_4_ + auVar114._8_4_;
          auVar266._12_4_ = auVar113._12_4_ + auVar114._12_4_;
          auVar283._8_8_ = 0x3f80000000000000;
          auVar283._0_8_ = 0x3f80000000000000;
          auVar113 = vsubps_avx(auVar283,auVar266);
          auVar114 = vsubps_avx(auVar283,auVar102);
          auVar150 = vsubps_avx(auVar72,auVar84);
          auVar308._0_4_ = fVar173 * auVar85._0_4_;
          auVar308._4_4_ = fVar173 * auVar85._4_4_;
          auVar308._8_4_ = fVar173 * auVar85._8_4_;
          auVar308._12_4_ = fVar173 * auVar85._12_4_;
          auVar294._0_4_ = fVar173 * auVar71._0_4_;
          auVar294._4_4_ = fVar173 * auVar71._4_4_;
          auVar294._8_4_ = fVar173 * auVar71._8_4_;
          auVar294._12_4_ = fVar173 * auVar71._12_4_;
          auVar71 = vminps_avx(auVar308,auVar294);
          auVar85 = vmaxps_avx(auVar294,auVar308);
          auVar237._0_4_ = fVar174 * auVar233._0_4_;
          auVar237._4_4_ = fVar174 * auVar233._4_4_;
          auVar237._8_4_ = fVar174 * auVar233._8_4_;
          auVar237._12_4_ = fVar174 * auVar233._12_4_;
          auVar217._0_4_ = fVar174 * auVar112._0_4_;
          auVar217._4_4_ = fVar174 * auVar112._4_4_;
          auVar217._8_4_ = fVar174 * auVar112._8_4_;
          auVar217._12_4_ = fVar174 * auVar112._12_4_;
          auVar233 = vminps_avx(auVar237,auVar217);
          auVar309._0_4_ = auVar71._0_4_ + auVar233._0_4_;
          auVar309._4_4_ = auVar71._4_4_ + auVar233._4_4_;
          auVar309._8_4_ = auVar71._8_4_ + auVar233._8_4_;
          auVar309._12_4_ = auVar71._12_4_ + auVar233._12_4_;
          auVar233 = vsubps_avx(auVar88,auVar84);
          auVar71 = vmaxps_avx(auVar217,auVar237);
          fVar111 = auVar150._0_4_;
          auVar238._0_4_ = fVar111 * auVar113._0_4_;
          fVar125 = auVar150._4_4_;
          auVar238._4_4_ = fVar125 * auVar113._4_4_;
          fVar126 = auVar150._8_4_;
          auVar238._8_4_ = fVar126 * auVar113._8_4_;
          fVar127 = auVar150._12_4_;
          auVar238._12_4_ = fVar127 * auVar113._12_4_;
          auVar218._0_4_ = auVar85._0_4_ + auVar71._0_4_;
          auVar218._4_4_ = auVar85._4_4_ + auVar71._4_4_;
          auVar218._8_4_ = auVar85._8_4_ + auVar71._8_4_;
          auVar218._12_4_ = auVar85._12_4_ + auVar71._12_4_;
          auVar295._8_8_ = 0x3f800000;
          auVar295._0_8_ = 0x3f800000;
          auVar85 = vsubps_avx(auVar295,auVar218);
          auVar71 = vsubps_avx(auVar295,auVar309);
          auVar310._0_4_ = fVar111 * auVar114._0_4_;
          auVar310._4_4_ = fVar125 * auVar114._4_4_;
          auVar310._8_4_ = fVar126 * auVar114._8_4_;
          auVar310._12_4_ = fVar127 * auVar114._12_4_;
          fVar142 = auVar233._0_4_;
          auVar267._0_4_ = fVar142 * auVar113._0_4_;
          fVar143 = auVar233._4_4_;
          auVar267._4_4_ = fVar143 * auVar113._4_4_;
          fVar175 = auVar233._8_4_;
          auVar267._8_4_ = fVar175 * auVar113._8_4_;
          fVar256 = auVar233._12_4_;
          auVar267._12_4_ = fVar256 * auVar113._12_4_;
          auVar103._0_4_ = fVar142 * auVar114._0_4_;
          auVar103._4_4_ = fVar143 * auVar114._4_4_;
          auVar103._8_4_ = fVar175 * auVar114._8_4_;
          auVar103._12_4_ = fVar256 * auVar114._12_4_;
          auVar331._0_4_ = fVar111 * auVar85._0_4_;
          auVar331._4_4_ = fVar125 * auVar85._4_4_;
          auVar331._8_4_ = fVar126 * auVar85._8_4_;
          auVar331._12_4_ = fVar127 * auVar85._12_4_;
          auVar284._0_4_ = fVar111 * auVar71._0_4_;
          auVar284._4_4_ = fVar125 * auVar71._4_4_;
          auVar284._8_4_ = fVar126 * auVar71._8_4_;
          auVar284._12_4_ = fVar127 * auVar71._12_4_;
          auVar219._0_4_ = fVar142 * auVar85._0_4_;
          auVar219._4_4_ = fVar143 * auVar85._4_4_;
          auVar219._8_4_ = fVar175 * auVar85._8_4_;
          auVar219._12_4_ = fVar256 * auVar85._12_4_;
          auVar296._0_4_ = fVar142 * auVar71._0_4_;
          auVar296._4_4_ = fVar143 * auVar71._4_4_;
          auVar296._8_4_ = fVar175 * auVar71._8_4_;
          auVar296._12_4_ = fVar256 * auVar71._12_4_;
          auVar85 = vminps_avx(auVar331,auVar284);
          auVar71 = vminps_avx(auVar219,auVar296);
          auVar85 = vminps_avx(auVar85,auVar71);
          auVar71 = vmaxps_avx(auVar284,auVar331);
          auVar233 = vminps_avx(auVar238,auVar310);
          auVar112 = vminps_avx(auVar267,auVar103);
          auVar233 = vminps_avx(auVar233,auVar112);
          auVar85 = vhaddps_avx(auVar85,auVar233);
          auVar233 = vmaxps_avx(auVar296,auVar219);
          auVar71 = vmaxps_avx(auVar233,auVar71);
          auVar233 = vmaxps_avx(auVar310,auVar238);
          auVar112 = vmaxps_avx(auVar103,auVar267);
          auVar233 = vmaxps_avx(auVar112,auVar233);
          auVar71 = vhaddps_avx(auVar71,auVar233);
          auVar233 = vshufps_avx(auVar84,auVar84,0x54);
          auVar233 = vsubps_avx(auVar233,_local_5e8);
          auVar85 = vshufps_avx(auVar85,auVar85,0xe8);
          auVar71 = vshufps_avx(auVar71,auVar71,0xe8);
          auVar239._0_4_ = auVar233._0_4_ + auVar85._0_4_;
          auVar239._4_4_ = auVar233._4_4_ + auVar85._4_4_;
          auVar239._8_4_ = auVar233._8_4_ + auVar85._8_4_;
          auVar239._12_4_ = auVar233._12_4_ + auVar85._12_4_;
          auVar220._0_4_ = auVar233._0_4_ + auVar71._0_4_;
          auVar220._4_4_ = auVar233._4_4_ + auVar71._4_4_;
          auVar220._8_4_ = auVar233._8_4_ + auVar71._8_4_;
          auVar220._12_4_ = auVar233._12_4_ + auVar71._12_4_;
          auVar85 = vmaxps_avx(auVar72,auVar239);
          auVar71 = vminps_avx(auVar220,auVar88);
          auVar85 = vcmpps_avx(auVar71,auVar85,1);
          auVar85 = vshufps_avx(auVar85,auVar85,0x50);
          local_668 = vinsertps_avx(auVar161,ZEXT416((uint)auVar178._0_4_),0x10);
          if ((auVar85 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              auVar85[0xf] < '\0') goto LAB_017612e4;
          bVar65 = 0;
          if ((auVar199._0_4_ < auVar239._0_4_) && (bVar65 = 0, auVar220._0_4_ < auVar88._0_4_)) {
            auVar71 = vmovshdup_avx(auVar239);
            auVar85 = vcmpps_avx(auVar220,auVar88,1);
            bVar65 = auVar85[4] & auVar161._0_4_ < auVar71._0_4_;
          }
          if (((3 < (uint)uVar62 || fVar160 < 0.001) | bVar65) == 1) {
            lVar64 = 200;
            do {
              fVar126 = auVar233._0_4_;
              fVar125 = 1.0 - fVar126;
              fVar160 = fVar125 * fVar125 * fVar125;
              fVar111 = fVar126 * 3.0 * fVar125 * fVar125;
              fVar125 = fVar125 * fVar126 * fVar126 * 3.0;
              auVar169._4_4_ = fVar160;
              auVar169._0_4_ = fVar160;
              auVar169._8_4_ = fVar160;
              auVar169._12_4_ = fVar160;
              auVar121._4_4_ = fVar111;
              auVar121._0_4_ = fVar111;
              auVar121._8_4_ = fVar111;
              auVar121._12_4_ = fVar111;
              auVar104._4_4_ = fVar125;
              auVar104._0_4_ = fVar125;
              auVar104._8_4_ = fVar125;
              auVar104._12_4_ = fVar125;
              fVar126 = fVar126 * fVar126 * fVar126;
              auVar195._0_4_ = (float)local_3c8._0_4_ * fVar126;
              auVar195._4_4_ = (float)local_3c8._4_4_ * fVar126;
              auVar195._8_4_ = fStack_3c0 * fVar126;
              auVar195._12_4_ = fStack_3bc * fVar126;
              auVar85 = vfmadd231ps_fma(auVar195,auVar182,auVar104);
              auVar85 = vfmadd231ps_fma(auVar85,auVar15,auVar121);
              auVar85 = vfmadd231ps_fma(auVar85,auVar14,auVar169);
              auVar105._8_8_ = auVar85._0_8_;
              auVar105._0_8_ = auVar85._0_8_;
              auVar85 = vshufpd_avx(auVar85,auVar85,3);
              auVar71 = vshufps_avx(auVar233,auVar233,0x55);
              auVar85 = vsubps_avx(auVar85,auVar105);
              auVar71 = vfmadd213ps_fma(auVar85,auVar71,auVar105);
              fVar160 = auVar71._0_4_;
              auVar85 = vshufps_avx(auVar71,auVar71,0x55);
              auVar106._0_4_ = fVar173 * fVar160 + fVar174 * auVar85._0_4_;
              auVar106._4_4_ = auVar321._4_4_ * fVar160 + auVar74._4_4_ * auVar85._4_4_;
              auVar106._8_4_ = auVar321._8_4_ * fVar160 + auVar74._8_4_ * auVar85._8_4_;
              auVar106._12_4_ = auVar321._12_4_ * fVar160 + auVar74._12_4_ * auVar85._12_4_;
              auVar233 = vsubps_avx(auVar233,auVar106);
              auVar85 = vandps_avx(auVar327,auVar71);
              auVar71 = vshufps_avx(auVar85,auVar85,0xf5);
              auVar85 = vmaxss_avx(auVar71,auVar85);
              if (auVar85._0_4_ < (float)local_2c8._0_4_) {
                local_218 = auVar233._0_4_;
                if ((0.0 <= local_218) && (local_218 <= 1.0)) {
                  auVar85 = vmovshdup_avx(auVar233);
                  fVar160 = auVar85._0_4_;
                  if ((0.0 <= fVar160) && (fVar160 <= 1.0)) {
                    auVar85 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                            ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c
                                           );
                    auVar113 = vinsertps_avx(auVar85,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128
                                                                   [2]),0x28);
                    auVar85 = vdpps_avx(auVar113,local_3d8,0x7f);
                    auVar321 = vdpps_avx(auVar113,local_3e8,0x7f);
                    auVar74 = vdpps_avx(auVar113,local_2d8,0x7f);
                    auVar71 = vdpps_avx(auVar113,local_2e8,0x7f);
                    auVar72 = vdpps_avx(auVar113,local_2f8,0x7f);
                    auVar88 = vdpps_avx(auVar113,local_308,0x7f);
                    auVar112 = vdpps_avx(auVar113,local_318,0x7f);
                    auVar113 = vdpps_avx(auVar113,local_328,0x7f);
                    fVar173 = 1.0 - fVar160;
                    auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar160 * auVar72._0_4_)),
                                              ZEXT416((uint)fVar173),auVar85);
                    auVar321 = vfmadd231ss_fma(ZEXT416((uint)(auVar88._0_4_ * fVar160)),
                                               ZEXT416((uint)fVar173),auVar321);
                    auVar74 = vfmadd231ss_fma(ZEXT416((uint)(auVar112._0_4_ * fVar160)),
                                              ZEXT416((uint)fVar173),auVar74);
                    auVar71 = vfmadd231ss_fma(ZEXT416((uint)(fVar160 * auVar113._0_4_)),
                                              ZEXT416((uint)fVar173),auVar71);
                    fVar125 = 1.0 - local_218;
                    fVar173 = fVar125 * local_218 * local_218 * 3.0;
                    fVar127 = local_218 * local_218 * local_218;
                    auVar74 = vfmadd231ss_fma(ZEXT416((uint)(fVar127 * auVar71._0_4_)),
                                              ZEXT416((uint)fVar173),auVar74);
                    fVar174 = local_218 * 3.0 * fVar125 * fVar125;
                    auVar321 = vfmadd231ss_fma(auVar74,ZEXT416((uint)fVar174),auVar321);
                    fVar111 = fVar125 * fVar125 * fVar125;
                    auVar85 = vfmadd231ss_fma(auVar321,ZEXT416((uint)fVar111),auVar85);
                    fVar126 = auVar85._0_4_;
                    if (((fVar69 <= fVar126) &&
                        (fVar142 = *(float *)(ray + k * 4 + 0x80), fVar126 <= fVar142)) &&
                       (pGVar6 = (context->scene->geometries).items[uVar61].ptr,
                       (pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
                      auVar85 = vshufps_avx(auVar233,auVar233,0x55);
                      auVar253._8_4_ = 0x3f800000;
                      auVar253._0_8_ = &DAT_3f8000003f800000;
                      auVar253._12_4_ = 0x3f800000;
                      auVar321 = vsubps_avx(auVar253,auVar85);
                      fVar143 = auVar85._0_4_;
                      auVar268._0_4_ = fVar143 * (float)local_418._0_4_;
                      fVar175 = auVar85._4_4_;
                      auVar268._4_4_ = fVar175 * (float)local_418._4_4_;
                      fVar256 = auVar85._8_4_;
                      auVar268._8_4_ = fVar256 * fStack_410;
                      fVar176 = auVar85._12_4_;
                      auVar268._12_4_ = fVar176 * fStack_40c;
                      local_4d8 = auVar17._0_4_;
                      fStack_4d4 = auVar17._4_4_;
                      fStack_4d0 = auVar17._8_4_;
                      fStack_4cc = auVar17._12_4_;
                      auVar285._0_4_ = fVar143 * local_4d8;
                      auVar285._4_4_ = fVar175 * fStack_4d4;
                      auVar285._8_4_ = fVar256 * fStack_4d0;
                      auVar285._12_4_ = fVar176 * fStack_4cc;
                      local_4e8 = auVar18._0_4_;
                      fStack_4e4 = auVar18._4_4_;
                      fStack_4e0 = auVar18._8_4_;
                      fStack_4dc = auVar18._12_4_;
                      auVar297._0_4_ = fVar143 * local_4e8;
                      auVar297._4_4_ = fVar175 * fStack_4e4;
                      auVar297._8_4_ = fVar256 * fStack_4e0;
                      auVar297._12_4_ = fVar176 * fStack_4dc;
                      local_4f8 = auVar209._0_4_;
                      fStack_4f4 = auVar209._4_4_;
                      fStack_4f0 = auVar209._8_4_;
                      fStack_4ec = auVar209._12_4_;
                      auVar311._0_4_ = fVar143 * local_4f8;
                      auVar311._4_4_ = fVar175 * fStack_4f4;
                      auVar311._8_4_ = fVar256 * fStack_4f0;
                      auVar311._12_4_ = fVar176 * fStack_4ec;
                      auVar74 = vfmadd231ps_fma(auVar268,auVar321,local_3f8);
                      auVar71 = vfmadd231ps_fma(auVar285,auVar321,auVar162);
                      auVar72 = vfmadd231ps_fma(auVar297,auVar321,local_408);
                      auVar88 = vfmadd231ps_fma(auVar311,auVar321,auVar16);
                      auVar321 = vsubps_avx(auVar71,auVar74);
                      auVar74 = vsubps_avx(auVar72,auVar71);
                      auVar71 = vsubps_avx(auVar88,auVar72);
                      auVar312._0_4_ = local_218 * auVar74._0_4_;
                      auVar312._4_4_ = local_218 * auVar74._4_4_;
                      auVar312._8_4_ = local_218 * auVar74._8_4_;
                      auVar312._12_4_ = local_218 * auVar74._12_4_;
                      auVar240._4_4_ = fVar125;
                      auVar240._0_4_ = fVar125;
                      auVar240._8_4_ = fVar125;
                      auVar240._12_4_ = fVar125;
                      auVar321 = vfmadd231ps_fma(auVar312,auVar240,auVar321);
                      auVar269._0_4_ = local_218 * auVar71._0_4_;
                      auVar269._4_4_ = local_218 * auVar71._4_4_;
                      auVar269._8_4_ = local_218 * auVar71._8_4_;
                      auVar269._12_4_ = local_218 * auVar71._12_4_;
                      auVar74 = vfmadd231ps_fma(auVar269,auVar240,auVar74);
                      auVar270._0_4_ = local_218 * auVar74._0_4_;
                      auVar270._4_4_ = local_218 * auVar74._4_4_;
                      auVar270._8_4_ = local_218 * auVar74._8_4_;
                      auVar270._12_4_ = local_218 * auVar74._12_4_;
                      auVar74 = vfmadd231ps_fma(auVar270,auVar240,auVar321);
                      auVar221._0_4_ = fVar127 * (float)local_378._0_4_;
                      auVar221._4_4_ = fVar127 * (float)local_378._4_4_;
                      auVar221._8_4_ = fVar127 * fStack_370;
                      auVar221._12_4_ = fVar127 * fStack_36c;
                      auVar156._4_4_ = fVar173;
                      auVar156._0_4_ = fVar173;
                      auVar156._8_4_ = fVar173;
                      auVar156._12_4_ = fVar173;
                      auVar321 = vfmadd132ps_fma(auVar156,auVar221,local_368);
                      auVar196._4_4_ = fVar174;
                      auVar196._0_4_ = fVar174;
                      auVar196._8_4_ = fVar174;
                      auVar196._12_4_ = fVar174;
                      auVar321 = vfmadd132ps_fma(auVar196,auVar321,local_358);
                      auVar222._0_4_ = auVar74._0_4_ * 3.0;
                      auVar222._4_4_ = auVar74._4_4_ * 3.0;
                      auVar222._8_4_ = auVar74._8_4_ * 3.0;
                      auVar222._12_4_ = auVar74._12_4_ * 3.0;
                      auVar170._4_4_ = fVar111;
                      auVar170._0_4_ = fVar111;
                      auVar170._8_4_ = fVar111;
                      auVar170._12_4_ = fVar111;
                      auVar74 = vfmadd132ps_fma(auVar170,auVar321,local_348);
                      auVar321 = vshufps_avx(auVar222,auVar222,0xc9);
                      auVar157._0_4_ = auVar74._0_4_ * auVar321._0_4_;
                      auVar157._4_4_ = auVar74._4_4_ * auVar321._4_4_;
                      auVar157._8_4_ = auVar74._8_4_ * auVar321._8_4_;
                      auVar157._12_4_ = auVar74._12_4_ * auVar321._12_4_;
                      auVar321 = vshufps_avx(auVar74,auVar74,0xc9);
                      auVar321 = vfmsub231ps_fma(auVar157,auVar222,auVar321);
                      local_228 = auVar321._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar126;
                        uVar70 = vextractps_avx(auVar321,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar70;
                        uVar70 = vextractps_avx(auVar321,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar70;
                        *(undefined4 *)(ray + k * 4 + 0xe0) = local_228;
                        *(float *)(ray + k * 4 + 0xf0) = local_218;
                        *(float *)(ray + k * 4 + 0x100) = fVar160;
                        *(uint *)(ray + k * 4 + 0x110) = uVar5;
                        *(uint *)(ray + k * 4 + 0x120) = uVar61;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        auVar74 = vshufps_avx(auVar321,auVar321,0x55);
                        auVar321 = vshufps_avx(auVar321,auVar321,0xaa);
                        local_248[0] = (RTCHitN)auVar74[0];
                        local_248[1] = (RTCHitN)auVar74[1];
                        local_248[2] = (RTCHitN)auVar74[2];
                        local_248[3] = (RTCHitN)auVar74[3];
                        local_248[4] = (RTCHitN)auVar74[4];
                        local_248[5] = (RTCHitN)auVar74[5];
                        local_248[6] = (RTCHitN)auVar74[6];
                        local_248[7] = (RTCHitN)auVar74[7];
                        local_248[8] = (RTCHitN)auVar74[8];
                        local_248[9] = (RTCHitN)auVar74[9];
                        local_248[10] = (RTCHitN)auVar74[10];
                        local_248[0xb] = (RTCHitN)auVar74[0xb];
                        local_248[0xc] = (RTCHitN)auVar74[0xc];
                        local_248[0xd] = (RTCHitN)auVar74[0xd];
                        local_248[0xe] = (RTCHitN)auVar74[0xe];
                        local_248[0xf] = (RTCHitN)auVar74[0xf];
                        local_238 = auVar321;
                        uStack_224 = local_228;
                        uStack_220 = local_228;
                        uStack_21c = local_228;
                        fStack_214 = local_218;
                        fStack_210 = local_218;
                        fStack_20c = local_218;
                        local_208 = auVar85;
                        local_1f8 = CONCAT44(uStack_3a4,local_3a8);
                        uStack_1f0 = CONCAT44(uStack_39c,uStack_3a0);
                        local_1e8._4_4_ = uStack_394;
                        local_1e8._0_4_ = local_398;
                        local_1e8._8_4_ = uStack_390;
                        local_1e8._12_4_ = uStack_38c;
                        vpcmpeqd_avx2(ZEXT1632(local_1e8),ZEXT1632(local_1e8));
                        uStack_1d4 = context->user->instID[0];
                        local_1d8 = uStack_1d4;
                        uStack_1d0 = uStack_1d4;
                        uStack_1cc = uStack_1d4;
                        uStack_1c8 = context->user->instPrimID[0];
                        uStack_1c4 = uStack_1c8;
                        uStack_1c0 = uStack_1c8;
                        uStack_1bc = uStack_1c8;
                        *(float *)(ray + k * 4 + 0x80) = fVar126;
                        local_468 = *local_458;
                        uStack_460 = local_458[1];
                        local_448.valid = (int *)&local_468;
                        local_448.geometryUserPtr = pGVar6->userPtr;
                        local_448.context = context->user;
                        local_448.hit = local_248;
                        local_448.N = 4;
                        local_448.ray = (RTCRayN *)ray;
                        if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar6->intersectionFilterN)(&local_448);
                          auVar110._8_56_ = extraout_var;
                          auVar110._0_8_ = extraout_XMM1_Qa;
                          auVar321 = auVar110._0_16_;
                        }
                        auVar53._8_8_ = uStack_460;
                        auVar53._0_8_ = local_468;
                        if (auVar53 == (undefined1  [16])0x0) {
                          auVar85 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar321 = vpcmpeqd_avx(auVar321,auVar321);
                          auVar85 = auVar85 ^ auVar321;
                        }
                        else {
                          p_Var12 = context->args->filter;
                          auVar321 = vpcmpeqd_avx(auVar85,auVar85);
                          if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var12)(&local_448);
                            auVar321 = vpcmpeqd_avx(auVar321,auVar321);
                          }
                          auVar54._8_8_ = uStack_460;
                          auVar54._0_8_ = local_468;
                          auVar74 = vpcmpeqd_avx(auVar54,_DAT_01feba10);
                          auVar85 = auVar74 ^ auVar321;
                          if (auVar54 != (undefined1  [16])0x0) {
                            auVar74 = auVar74 ^ auVar321;
                            auVar321 = vmaskmovps_avx(auVar74,*(undefined1 (*) [16])local_448.hit);
                            *(undefined1 (*) [16])(local_448.ray + 0xc0) = auVar321;
                            auVar321 = vmaskmovps_avx(auVar74,*(undefined1 (*) [16])
                                                               (local_448.hit + 0x10));
                            *(undefined1 (*) [16])(local_448.ray + 0xd0) = auVar321;
                            auVar321 = vmaskmovps_avx(auVar74,*(undefined1 (*) [16])
                                                               (local_448.hit + 0x20));
                            *(undefined1 (*) [16])(local_448.ray + 0xe0) = auVar321;
                            auVar321 = vmaskmovps_avx(auVar74,*(undefined1 (*) [16])
                                                               (local_448.hit + 0x30));
                            *(undefined1 (*) [16])(local_448.ray + 0xf0) = auVar321;
                            auVar321 = vmaskmovps_avx(auVar74,*(undefined1 (*) [16])
                                                               (local_448.hit + 0x40));
                            *(undefined1 (*) [16])(local_448.ray + 0x100) = auVar321;
                            auVar321 = vmaskmovps_avx(auVar74,*(undefined1 (*) [16])
                                                               (local_448.hit + 0x50));
                            *(undefined1 (*) [16])(local_448.ray + 0x110) = auVar321;
                            auVar321 = vmaskmovps_avx(auVar74,*(undefined1 (*) [16])
                                                               (local_448.hit + 0x60));
                            *(undefined1 (*) [16])(local_448.ray + 0x120) = auVar321;
                            auVar321 = vmaskmovps_avx(auVar74,*(undefined1 (*) [16])
                                                               (local_448.hit + 0x70));
                            *(undefined1 (*) [16])(local_448.ray + 0x130) = auVar321;
                            auVar321 = vmaskmovps_avx(auVar74,*(undefined1 (*) [16])
                                                               (local_448.hit + 0x80));
                            *(undefined1 (*) [16])(local_448.ray + 0x140) = auVar321;
                          }
                        }
                        auVar107._8_8_ = 0x100000001;
                        auVar107._0_8_ = 0x100000001;
                        if ((auVar107 & auVar85) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar142;
                        }
                      }
                    }
                  }
                }
                break;
              }
              lVar64 = lVar64 + -1;
            } while (lVar64 != 0);
          }
          else {
            bVar49 = false;
          }
        }
      }
    } while (bVar49);
    local_338 = vinsertps_avx(auVar13,ZEXT416((uint)fVar172),0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }